

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_t<embree::avx2::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx2::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  undefined1 (*pauVar5) [32];
  float *pfVar6;
  uint uVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar9;
  undefined1 auVar10 [32];
  Primitive PVar11;
  uint uVar12;
  int iVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [28];
  uint uVar79;
  RTCIntersectArguments *pRVar80;
  ulong uVar81;
  long lVar82;
  long lVar83;
  ulong uVar84;
  ulong uVar85;
  undefined4 uVar86;
  undefined8 unaff_R13;
  long lVar87;
  ulong uVar88;
  undefined8 uVar89;
  float fVar107;
  vint4 bi_2;
  undefined1 auVar90 [16];
  float fVar105;
  float fVar109;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar106;
  float fVar108;
  float fVar110;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar94 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  vint4 bi_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar117 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [64];
  float fVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  vint4 ai_2;
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  vint4 ai;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  vint4 bi;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  vint4 ai_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar179 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  undefined1 auVar177 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  undefined4 uVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [64];
  float fVar194;
  float fVar201;
  undefined1 auVar196 [16];
  float fVar195;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  undefined1 auVar200 [64];
  float fVar202;
  float fVar207;
  float fVar208;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar210;
  float fVar211;
  float fVar214;
  undefined1 auVar205 [32];
  float fVar209;
  float fVar212;
  float fVar213;
  float fVar215;
  float fVar216;
  undefined1 auVar206 [32];
  undefined1 auVar217 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_780 [16];
  ulong local_768;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined1 (*local_600) [16];
  Precalculations *local_5f8;
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [32];
  undefined1 local_590 [16];
  undefined1 local_580 [8];
  undefined4 uStack_578;
  undefined4 uStack_574;
  float local_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  LinearSpace3fa *local_4f0;
  ulong local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_450;
  undefined4 uStack_44c;
  undefined4 uStack_448;
  undefined4 uStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined4 uStack_324;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  int local_1c0;
  int local_1bc;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  float local_140 [4];
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar178 [16];
  
  PVar11 = prim[1];
  uVar84 = (ulong)(byte)PVar11;
  fVar128 = *(float *)(prim + uVar84 * 0x19 + 0x12);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar17 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar17 = vinsertps_avx(auVar17,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar16 = vsubps_avx(auVar16,*(undefined1 (*) [16])(prim + uVar84 * 0x19 + 6));
  auVar90._0_4_ = fVar128 * auVar16._0_4_;
  auVar90._4_4_ = fVar128 * auVar16._4_4_;
  auVar90._8_4_ = fVar128 * auVar16._8_4_;
  auVar90._12_4_ = fVar128 * auVar16._12_4_;
  auVar152._0_4_ = fVar128 * auVar17._0_4_;
  auVar152._4_4_ = fVar128 * auVar17._4_4_;
  auVar152._8_4_ = fVar128 * auVar17._8_4_;
  auVar152._12_4_ = fVar128 * auVar17._12_4_;
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 5 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xb + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xc + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xd + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x12 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x13 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar193 = ZEXT1664(auVar92);
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0x14 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar203._4_4_ = auVar152._0_4_;
  auVar203._0_4_ = auVar152._0_4_;
  auVar203._8_4_ = auVar152._0_4_;
  auVar203._12_4_ = auVar152._0_4_;
  auVar115 = vshufps_avx(auVar152,auVar152,0x55);
  auVar91 = vshufps_avx(auVar152,auVar152,0xaa);
  fVar128 = auVar91._0_4_;
  auVar184._0_4_ = fVar128 * auVar18._0_4_;
  fVar105 = auVar91._4_4_;
  auVar184._4_4_ = fVar105 * auVar18._4_4_;
  fVar107 = auVar91._8_4_;
  auVar184._8_4_ = fVar107 * auVar18._8_4_;
  fVar109 = auVar91._12_4_;
  auVar184._12_4_ = fVar109 * auVar18._12_4_;
  auVar177._0_4_ = auVar21._0_4_ * fVar128;
  auVar177._4_4_ = auVar21._4_4_ * fVar105;
  auVar177._8_4_ = auVar21._8_4_ * fVar107;
  auVar177._12_4_ = auVar21._12_4_ * fVar109;
  auVar171._0_4_ = auVar129._0_4_ * fVar128;
  auVar171._4_4_ = auVar129._4_4_ * fVar105;
  auVar171._8_4_ = auVar129._8_4_ * fVar107;
  auVar171._12_4_ = auVar129._12_4_ * fVar109;
  auVar91 = vfmadd231ps_fma(auVar184,auVar115,auVar17);
  auVar116 = vfmadd231ps_fma(auVar177,auVar115,auVar20);
  auVar115 = vfmadd231ps_fma(auVar171,auVar92,auVar115);
  auVar139 = vfmadd231ps_fma(auVar91,auVar203,auVar16);
  auVar116 = vfmadd231ps_fma(auVar116,auVar203,auVar19);
  auVar145 = vfmadd231ps_fma(auVar115,auVar93,auVar203);
  auVar204._4_4_ = auVar90._0_4_;
  auVar204._0_4_ = auVar90._0_4_;
  auVar204._8_4_ = auVar90._0_4_;
  auVar204._12_4_ = auVar90._0_4_;
  auVar115 = vshufps_avx(auVar90,auVar90,0x55);
  auVar91 = vshufps_avx(auVar90,auVar90,0xaa);
  fVar128 = auVar91._0_4_;
  auVar153._0_4_ = fVar128 * auVar18._0_4_;
  fVar105 = auVar91._4_4_;
  auVar153._4_4_ = fVar105 * auVar18._4_4_;
  fVar107 = auVar91._8_4_;
  auVar153._8_4_ = fVar107 * auVar18._8_4_;
  fVar109 = auVar91._12_4_;
  auVar153._12_4_ = fVar109 * auVar18._12_4_;
  auVar114._0_4_ = auVar21._0_4_ * fVar128;
  auVar114._4_4_ = auVar21._4_4_ * fVar105;
  auVar114._8_4_ = auVar21._8_4_ * fVar107;
  auVar114._12_4_ = auVar21._12_4_ * fVar109;
  auVar91._0_4_ = auVar129._0_4_ * fVar128;
  auVar91._4_4_ = auVar129._4_4_ * fVar105;
  auVar91._8_4_ = auVar129._8_4_ * fVar107;
  auVar91._12_4_ = auVar129._12_4_ * fVar109;
  auVar17 = vfmadd231ps_fma(auVar153,auVar115,auVar17);
  auVar18 = vfmadd231ps_fma(auVar114,auVar115,auVar20);
  auVar20 = vfmadd231ps_fma(auVar91,auVar115,auVar92);
  auVar21 = vfmadd231ps_fma(auVar17,auVar204,auVar16);
  auVar92 = vfmadd231ps_fma(auVar18,auVar204,auVar19);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar129 = vfmadd231ps_fma(auVar20,auVar204,auVar93);
  auVar16 = vandps_avx(auVar139,local_290);
  auVar144._8_4_ = 0x219392ef;
  auVar144._0_8_ = 0x219392ef219392ef;
  auVar144._12_4_ = 0x219392ef;
  auVar16 = vcmpps_avx(auVar16,auVar144,1);
  auVar17 = vblendvps_avx(auVar139,auVar144,auVar16);
  auVar16 = vandps_avx(auVar116,local_290);
  auVar16 = vcmpps_avx(auVar16,auVar144,1);
  auVar18 = vblendvps_avx(auVar116,auVar144,auVar16);
  auVar16 = vandps_avx(local_290,auVar145);
  auVar16 = vcmpps_avx(auVar16,auVar144,1);
  auVar16 = vblendvps_avx(auVar145,auVar144,auVar16);
  auVar19 = vrcpps_avx(auVar17);
  auVar172._8_4_ = 0x3f800000;
  auVar172._0_8_ = 0x3f8000003f800000;
  auVar172._12_4_ = 0x3f800000;
  auVar17 = vfnmadd213ps_fma(auVar17,auVar19,auVar172);
  auVar19 = vfmadd132ps_fma(auVar17,auVar19,auVar19);
  auVar17 = vrcpps_avx(auVar18);
  auVar18 = vfnmadd213ps_fma(auVar18,auVar17,auVar172);
  auVar20 = vfmadd132ps_fma(auVar18,auVar17,auVar17);
  auVar17 = vrcpps_avx(auVar16);
  auVar16 = vfnmadd213ps_fma(auVar16,auVar17,auVar172);
  auVar93 = vfmadd132ps_fma(auVar16,auVar17,auVar17);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar84 * 7 + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar18 = vsubps_avx(auVar16,auVar21);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar84 * 9 + 6);
  auVar16 = vpmovsxwd_avx(auVar17);
  auVar145._0_4_ = auVar19._0_4_ * auVar18._0_4_;
  auVar145._4_4_ = auVar19._4_4_ * auVar18._4_4_;
  auVar145._8_4_ = auVar19._8_4_ * auVar18._8_4_;
  auVar145._12_4_ = auVar19._12_4_ * auVar18._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar21);
  auVar154._0_4_ = auVar19._0_4_ * auVar16._0_4_;
  auVar154._4_4_ = auVar19._4_4_ * auVar16._4_4_;
  auVar154._8_4_ = auVar19._8_4_ * auVar16._8_4_;
  auVar154._12_4_ = auVar19._12_4_ * auVar16._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar84 * 0xe + 6);
  auVar16 = vpmovsxwd_avx(auVar18);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vsubps_avx(auVar16,auVar92);
  auVar116._1_3_ = 0;
  auVar116[0] = PVar11;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar11 * 0x10 + 6);
  auVar16 = vpmovsxwd_avx(auVar19);
  auVar161._0_4_ = auVar20._0_4_ * auVar17._0_4_;
  auVar161._4_4_ = auVar20._4_4_ * auVar17._4_4_;
  auVar161._8_4_ = auVar20._8_4_ * auVar17._8_4_;
  auVar161._12_4_ = auVar20._12_4_ * auVar17._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar92);
  auVar115._0_4_ = auVar20._0_4_ * auVar16._0_4_;
  auVar115._4_4_ = auVar20._4_4_ * auVar16._4_4_;
  auVar115._8_4_ = auVar20._8_4_ * auVar16._8_4_;
  auVar115._12_4_ = auVar20._12_4_ * auVar16._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar84 * 0x15 + 6);
  auVar16 = vpmovsxwd_avx(auVar20);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar129);
  auVar139._0_4_ = auVar93._0_4_ * auVar16._0_4_;
  auVar139._4_4_ = auVar93._4_4_ * auVar16._4_4_;
  auVar139._8_4_ = auVar93._8_4_ * auVar16._8_4_;
  auVar139._12_4_ = auVar93._12_4_ * auVar16._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar84 * 0x17 + 6);
  auVar16 = vpmovsxwd_avx(auVar21);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar129);
  auVar92._0_4_ = auVar93._0_4_ * auVar16._0_4_;
  auVar92._4_4_ = auVar93._4_4_ * auVar16._4_4_;
  auVar92._8_4_ = auVar93._8_4_ * auVar16._8_4_;
  auVar92._12_4_ = auVar93._12_4_ * auVar16._12_4_;
  auVar16 = vpminsd_avx(auVar145,auVar154);
  auVar17 = vpminsd_avx(auVar161,auVar115);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  auVar17 = vpminsd_avx(auVar139,auVar92);
  uVar86 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar178._4_4_ = uVar86;
  auVar178._0_4_ = uVar86;
  auVar178._8_4_ = uVar86;
  auVar178._12_4_ = uVar86;
  auVar183 = ZEXT1664(auVar178);
  auVar17 = vmaxps_avx(auVar17,auVar178);
  auVar16 = vmaxps_avx(auVar16,auVar17);
  local_2a0._0_4_ = auVar16._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar16._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar16._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar16._12_4_ * 0.99999964;
  auVar16 = vpmaxsd_avx(auVar145,auVar154);
  auVar17 = vpmaxsd_avx(auVar161,auVar115);
  auVar16 = vminps_avx(auVar16,auVar17);
  auVar17 = vpmaxsd_avx(auVar139,auVar92);
  uVar86 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar129._4_4_ = uVar86;
  auVar129._0_4_ = uVar86;
  auVar129._8_4_ = uVar86;
  auVar129._12_4_ = uVar86;
  auVar17 = vminps_avx(auVar17,auVar129);
  auVar16 = vminps_avx(auVar16,auVar17);
  auVar93._0_4_ = auVar16._0_4_ * 1.0000004;
  auVar93._4_4_ = auVar16._4_4_ * 1.0000004;
  auVar93._8_4_ = auVar16._8_4_ * 1.0000004;
  auVar93._12_4_ = auVar16._12_4_ * 1.0000004;
  auVar116[4] = PVar11;
  auVar116._5_3_ = 0;
  auVar116[8] = PVar11;
  auVar116._9_3_ = 0;
  auVar116[0xc] = PVar11;
  auVar116._13_3_ = 0;
  auVar17 = vpcmpgtd_avx(auVar116,_DAT_01f4ad30);
  auVar16 = vcmpps_avx(local_2a0,auVar93,2);
  auVar16 = vandps_avx(auVar16,auVar17);
  uVar86 = vmovmskps_avx(auVar16);
  local_4f0 = pre->ray_space + k;
  local_4e0 = mm_lookupmask_ps._16_8_;
  uStack_4d8 = mm_lookupmask_ps._24_8_;
  uStack_4d0 = mm_lookupmask_ps._16_8_;
  uStack_4c8 = mm_lookupmask_ps._24_8_;
  local_600 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_4e8 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar86);
  local_5f8 = pre;
  while (local_4e8 != 0) {
    local_760 = auVar183._0_32_;
    local_6e0 = auVar193._0_32_;
    lVar87 = 0;
    for (uVar84 = local_4e8; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
      lVar87 = lVar87 + 1;
    }
    uVar79 = *(uint *)(prim + 2);
    local_768 = (ulong)uVar79;
    uVar12 = *(uint *)(prim + lVar87 * 4 + 6);
    pGVar14 = (context->scene->geometries).items[local_768].ptr;
    uVar84 = (ulong)*(uint *)(*(long *)&pGVar14->field_0x58 +
                             pGVar14[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar12);
    p_Var15 = pGVar14[1].intersectionFilterN;
    lVar87 = *(long *)&pGVar14[1].time_range.upper;
    pauVar1 = (undefined1 (*) [16])(lVar87 + (long)p_Var15 * uVar84);
    local_610 = *(undefined8 *)*pauVar1;
    uStack_608 = *(undefined8 *)(*pauVar1 + 8);
    pauVar2 = (undefined1 (*) [16])(lVar87 + (uVar84 + 1) * (long)p_Var15);
    local_620 = *(undefined8 *)*pauVar2;
    uStack_618 = *(undefined8 *)(*pauVar2 + 8);
    pauVar3 = (undefined1 (*) [16])(lVar87 + (uVar84 + 2) * (long)p_Var15);
    local_630 = *(undefined8 *)*pauVar3;
    uStack_628 = *(undefined8 *)(*pauVar3 + 8);
    uVar88 = local_4e8 - 1 & local_4e8;
    pauVar4 = (undefined1 (*) [12])(lVar87 + (uVar84 + 3) * (long)p_Var15);
    local_570 = (float)*(undefined8 *)*pauVar4;
    fStack_56c = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
    fStack_568 = (float)*(undefined8 *)(*pauVar4 + 8);
    fStack_564 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
    uVar84 = uVar88 - 1;
    if (uVar88 != 0) {
      uVar84 = uVar84 & uVar88;
      for (uVar81 = uVar88; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
      }
      uVar81 = uVar84;
      if (uVar84 != 0) {
        for (; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
        }
      }
    }
    auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    iVar13 = (int)pGVar14[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar19 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar17 = vsubps_avx(*pauVar1,auVar19);
    uVar86 = auVar17._0_4_;
    auVar146._4_4_ = uVar86;
    auVar146._0_4_ = uVar86;
    auVar146._8_4_ = uVar86;
    auVar146._12_4_ = uVar86;
    auVar16 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
    aVar8 = (local_4f0->vx).field_0;
    aVar9 = (local_4f0->vy).field_0;
    fVar128 = (local_4f0->vz).field_0.m128[0];
    fVar105 = *(float *)((long)&(local_4f0->vz).field_0 + 4);
    fVar107 = *(float *)((long)&(local_4f0->vz).field_0 + 8);
    fVar109 = *(float *)((long)&(local_4f0->vz).field_0 + 0xc);
    auVar162._0_4_ = fVar128 * auVar17._0_4_;
    auVar162._4_4_ = fVar105 * auVar17._4_4_;
    auVar162._8_4_ = fVar107 * auVar17._8_4_;
    auVar162._12_4_ = fVar109 * auVar17._12_4_;
    auVar16 = vfmadd231ps_fma(auVar162,(undefined1  [16])aVar9,auVar16);
    auVar21 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar8,auVar146);
    auVar16 = vblendps_avx(auVar21,*pauVar1,8);
    auVar18 = vsubps_avx(*pauVar2,auVar19);
    uVar86 = auVar18._0_4_;
    auVar163._4_4_ = uVar86;
    auVar163._0_4_ = uVar86;
    auVar163._8_4_ = uVar86;
    auVar163._12_4_ = uVar86;
    auVar17 = vshufps_avx(auVar18,auVar18,0x55);
    auVar18 = vshufps_avx(auVar18,auVar18,0xaa);
    auVar185._0_4_ = fVar128 * auVar18._0_4_;
    auVar185._4_4_ = fVar105 * auVar18._4_4_;
    auVar185._8_4_ = fVar107 * auVar18._8_4_;
    auVar185._12_4_ = fVar109 * auVar18._12_4_;
    auVar17 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar9,auVar17);
    auVar93 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar8,auVar163);
    auVar17 = vblendps_avx(auVar93,*pauVar2,8);
    auVar20 = vsubps_avx(*pauVar3,auVar19);
    uVar86 = auVar20._0_4_;
    auVar173._4_4_ = uVar86;
    auVar173._0_4_ = uVar86;
    auVar173._8_4_ = uVar86;
    auVar173._12_4_ = uVar86;
    auVar18 = vshufps_avx(auVar20,auVar20,0x55);
    auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
    auVar192._0_4_ = fVar128 * auVar20._0_4_;
    auVar192._4_4_ = fVar105 * auVar20._4_4_;
    auVar192._8_4_ = fVar107 * auVar20._8_4_;
    auVar192._12_4_ = fVar109 * auVar20._12_4_;
    auVar18 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar9,auVar18);
    auVar92 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar8,auVar173);
    auVar18 = vblendps_avx(auVar92,*pauVar3,8);
    auVar75._12_4_ = fStack_564;
    auVar75._0_12_ = *pauVar4;
    auVar20 = vsubps_avx(auVar75,auVar19);
    uVar86 = auVar20._0_4_;
    auVar174._4_4_ = uVar86;
    auVar174._0_4_ = uVar86;
    auVar174._8_4_ = uVar86;
    auVar174._12_4_ = uVar86;
    auVar19 = vshufps_avx(auVar20,auVar20,0x55);
    auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
    auVar196._0_4_ = fVar128 * auVar20._0_4_;
    auVar196._4_4_ = fVar105 * auVar20._4_4_;
    auVar196._8_4_ = fVar107 * auVar20._8_4_;
    auVar196._12_4_ = fVar109 * auVar20._12_4_;
    auVar19 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar9,auVar19);
    auVar129 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar8,auVar174);
    auVar19 = vblendps_avx(auVar129,auVar75,8);
    auVar16 = vandps_avx(auVar16,local_290);
    auVar17 = vandps_avx(auVar17,local_290);
    auVar20 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vandps_avx(auVar18,local_290);
    auVar17 = vandps_avx(auVar19,local_290);
    auVar16 = vmaxps_avx(auVar16,auVar17);
    auVar16 = vmaxps_avx(auVar20,auVar16);
    auVar17 = vmovshdup_avx(auVar16);
    auVar17 = vmaxss_avx(auVar17,auVar16);
    auVar16 = vshufpd_avx(auVar16,auVar16,1);
    auVar16 = vmaxss_avx(auVar16,auVar17);
    lVar87 = (long)iVar13 * 0x44;
    auVar17 = vmovshdup_avx(auVar21);
    uVar89 = auVar17._0_8_;
    local_4c0._8_8_ = uVar89;
    local_4c0._0_8_ = uVar89;
    local_4c0._16_8_ = uVar89;
    local_4c0._24_8_ = uVar89;
    auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar87 + 0x484);
    auVar17 = vmovshdup_avx(auVar93);
    uVar89 = auVar17._0_8_;
    local_6a0._8_8_ = uVar89;
    local_6a0._0_8_ = uVar89;
    local_6a0._16_8_ = uVar89;
    local_6a0._24_8_ = uVar89;
    auVar165 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar87 + 0x908);
    uVar191 = auVar92._0_4_;
    local_6c0._4_4_ = uVar191;
    local_6c0._0_4_ = uVar191;
    local_6c0._8_4_ = uVar191;
    local_6c0._12_4_ = uVar191;
    local_6c0._16_4_ = uVar191;
    local_6c0._20_4_ = uVar191;
    local_6c0._24_4_ = uVar191;
    local_6c0._28_4_ = uVar191;
    auVar17 = vmovshdup_avx(auVar92);
    uVar89 = auVar17._0_8_;
    local_660._8_8_ = uVar89;
    local_660._0_8_ = uVar89;
    local_660._16_8_ = uVar89;
    local_660._24_8_ = uVar89;
    pauVar5 = (undefined1 (*) [32])(catmullrom_basis0 + lVar87 + 0xd8c);
    fVar105 = *(float *)*pauVar5;
    fVar107 = *(float *)(catmullrom_basis0 + lVar87 + 0xd90);
    fVar109 = *(float *)(catmullrom_basis0 + lVar87 + 0xd94);
    fVar212 = *(float *)(catmullrom_basis0 + lVar87 + 0xd98);
    fVar214 = *(float *)(catmullrom_basis0 + lVar87 + 0xd9c);
    fVar216 = *(float *)(catmullrom_basis0 + lVar87 + 0xda0);
    fVar106 = *(float *)(catmullrom_basis0 + lVar87 + 0xda4);
    auVar78 = *(undefined1 (*) [28])*pauVar5;
    fVar194 = auVar129._0_4_;
    auVar17 = vmovshdup_avx(auVar129);
    local_700 = auVar17._0_8_;
    auVar103._0_4_ = fVar105 * fVar194;
    auVar103._4_4_ = fVar107 * fVar194;
    auVar103._8_4_ = fVar109 * fVar194;
    auVar103._12_4_ = fVar212 * fVar194;
    auVar103._16_4_ = fVar214 * fVar194;
    auVar103._20_4_ = fVar216 * fVar194;
    auVar103._24_4_ = fVar106 * fVar194;
    auVar103._28_4_ = 0;
    fVar202 = auVar17._0_4_;
    auVar95._0_4_ = fVar202 * fVar105;
    fVar207 = auVar17._4_4_;
    auVar95._4_4_ = fVar207 * fVar107;
    auVar95._8_4_ = fVar202 * fVar109;
    auVar95._12_4_ = fVar207 * fVar212;
    auVar95._16_4_ = fVar202 * fVar214;
    auVar95._20_4_ = fVar207 * fVar216;
    auVar95._24_4_ = fVar202 * fVar106;
    auVar95._28_4_ = 0;
    auVar17 = vfmadd231ps_fma(auVar103,auVar165,local_6c0);
    auVar18 = vfmadd231ps_fma(auVar95,auVar165,local_660);
    uVar86 = auVar93._0_4_;
    local_720._4_4_ = uVar86;
    local_720._0_4_ = uVar86;
    local_720._8_4_ = uVar86;
    local_720._12_4_ = uVar86;
    local_720._16_4_ = uVar86;
    local_720._20_4_ = uVar86;
    local_720._24_4_ = uVar86;
    local_720._28_4_ = uVar86;
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar125,local_720);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar125,local_6a0);
    auVar95 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar87);
    uVar86 = auVar21._0_4_;
    local_680._4_4_ = uVar86;
    local_680._0_4_ = uVar86;
    local_680._8_4_ = uVar86;
    local_680._12_4_ = uVar86;
    local_680._16_4_ = uVar86;
    local_680._20_4_ = uVar86;
    local_680._24_4_ = uVar86;
    local_680._28_4_ = uVar86;
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar95,local_680);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar95,local_4c0);
    auVar103 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar87 + 0x908);
    local_340 = *(float *)(catmullrom_basis1 + lVar87 + 0xd8c);
    fStack_33c = *(float *)(catmullrom_basis1 + lVar87 + 0xd90);
    fStack_338 = *(float *)(catmullrom_basis1 + lVar87 + 0xd94);
    fStack_334 = *(float *)(catmullrom_basis1 + lVar87 + 0xd98);
    fStack_330 = *(float *)(catmullrom_basis1 + lVar87 + 0xd9c);
    fStack_32c = *(float *)(catmullrom_basis1 + lVar87 + 0xda0);
    fStack_328 = *(float *)(catmullrom_basis1 + lVar87 + 0xda4);
    uStack_324 = *(undefined4 *)(catmullrom_basis1 + lVar87 + 0xda8);
    auVar123._4_4_ = fStack_33c * fVar194;
    auVar123._0_4_ = local_340 * fVar194;
    auVar123._8_4_ = fStack_338 * fVar194;
    auVar123._12_4_ = fStack_334 * fVar194;
    auVar123._16_4_ = fStack_330 * fVar194;
    auVar123._20_4_ = fStack_32c * fVar194;
    auVar123._24_4_ = fStack_328 * fVar194;
    auVar123._28_4_ = fVar194;
    auVar19 = vfmadd231ps_fma(auVar123,auVar103,local_6c0);
    auVar10._4_4_ = fVar207 * fStack_33c;
    auVar10._0_4_ = fVar202 * local_340;
    auVar10._8_4_ = fVar202 * fStack_338;
    auVar10._12_4_ = fVar207 * fStack_334;
    auVar10._16_4_ = fVar202 * fStack_330;
    auVar10._20_4_ = fVar207 * fStack_32c;
    auVar10._24_4_ = fVar202 * fStack_328;
    auVar10._28_4_ = uVar191;
    auVar20 = vfmadd231ps_fma(auVar10,auVar103,local_660);
    auVar123 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar87 + 0x484);
    auVar160 = ZEXT3264(auVar123);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar123,local_720);
    auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar123,local_6a0);
    auVar10 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar87);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar10,local_680);
    auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar10,local_4c0);
    local_2c0 = ZEXT1632(auVar19);
    local_300 = ZEXT1632(auVar17);
    auVar104 = vsubps_avx(local_2c0,local_300);
    _local_2e0 = ZEXT1632(auVar20);
    auVar96 = ZEXT1632(auVar18);
    local_360 = vsubps_avx(_local_2e0,auVar96);
    auVar97._0_4_ = auVar18._0_4_ * auVar104._0_4_;
    auVar97._4_4_ = auVar18._4_4_ * auVar104._4_4_;
    auVar97._8_4_ = auVar18._8_4_ * auVar104._8_4_;
    auVar97._12_4_ = auVar18._12_4_ * auVar104._12_4_;
    auVar97._16_4_ = auVar104._16_4_ * 0.0;
    auVar97._20_4_ = auVar104._20_4_ * 0.0;
    auVar97._24_4_ = auVar104._24_4_ * 0.0;
    auVar97._28_4_ = 0;
    fVar108 = local_360._0_4_;
    auVar119._0_4_ = fVar108 * auVar17._0_4_;
    fVar110 = local_360._4_4_;
    auVar119._4_4_ = fVar110 * auVar17._4_4_;
    fVar111 = local_360._8_4_;
    auVar119._8_4_ = fVar111 * auVar17._8_4_;
    fVar112 = local_360._12_4_;
    auVar119._12_4_ = fVar112 * auVar17._12_4_;
    fVar113 = local_360._16_4_;
    auVar119._16_4_ = fVar113 * 0.0;
    fVar211 = local_360._20_4_;
    auVar119._20_4_ = fVar211 * 0.0;
    fVar195 = local_360._24_4_;
    auVar119._24_4_ = fVar195 * 0.0;
    auVar119._28_4_ = 0;
    auVar97 = vsubps_avx(auVar97,auVar119);
    auVar17 = vpermilps_avx(*pauVar1,0xff);
    uVar89 = auVar17._0_8_;
    local_80._8_8_ = uVar89;
    local_80._0_8_ = uVar89;
    local_80._16_8_ = uVar89;
    local_80._24_8_ = uVar89;
    auVar18 = vpermilps_avx(*pauVar2,0xff);
    uVar89 = auVar18._0_8_;
    local_a0._8_8_ = uVar89;
    local_a0._0_8_ = uVar89;
    local_a0._16_8_ = uVar89;
    local_a0._24_8_ = uVar89;
    auVar18 = vpermilps_avx(*pauVar3,0xff);
    uVar89 = auVar18._0_8_;
    local_c0._8_8_ = uVar89;
    local_c0._0_8_ = uVar89;
    local_c0._16_8_ = uVar89;
    local_c0._24_8_ = uVar89;
    auVar76._12_4_ = fStack_564;
    auVar76._0_12_ = *pauVar4;
    auVar18 = vpermilps_avx(auVar76,0xff);
    local_e0 = auVar18._0_8_;
    fVar128 = auVar18._0_4_;
    auVar164._0_4_ = fVar105 * fVar128;
    fVar105 = auVar18._4_4_;
    auVar164._4_4_ = fVar107 * fVar105;
    auVar164._8_4_ = fVar109 * fVar128;
    auVar164._12_4_ = fVar212 * fVar105;
    auVar164._16_4_ = fVar214 * fVar128;
    auVar164._20_4_ = fVar216 * fVar105;
    auVar164._24_4_ = fVar106 * fVar128;
    auVar164._28_4_ = 0;
    auVar18 = vfmadd231ps_fma(auVar164,local_c0,auVar165);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),local_a0,auVar125);
    auVar19 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar95,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    auVar156._4_4_ = fStack_33c * fVar105;
    auVar156._0_4_ = local_340 * fVar128;
    auVar156._8_4_ = fStack_338 * fVar128;
    auVar156._12_4_ = fStack_334 * fVar105;
    auVar156._16_4_ = fStack_330 * fVar128;
    auVar156._20_4_ = fStack_32c * fVar105;
    auVar156._24_4_ = fStack_328 * fVar128;
    auVar156._28_4_ = auVar95._28_4_;
    auVar18 = vfmadd231ps_fma(auVar156,auVar103,local_c0);
    auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar123,local_a0);
    auVar20 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar10,local_80);
    auVar23._4_4_ = fVar110 * fVar110;
    auVar23._0_4_ = fVar108 * fVar108;
    auVar23._8_4_ = fVar111 * fVar111;
    auVar23._12_4_ = fVar112 * fVar112;
    auVar23._16_4_ = fVar113 * fVar113;
    auVar23._20_4_ = fVar211 * fVar211;
    auVar23._24_4_ = fVar195 * fVar195;
    auVar23._28_4_ = auVar17._4_4_;
    auVar17 = vfmadd231ps_fma(auVar23,auVar104,auVar104);
    auVar156 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar20));
    auVar179._4_4_ = auVar156._4_4_ * auVar156._4_4_ * auVar17._4_4_;
    auVar179._0_4_ = auVar156._0_4_ * auVar156._0_4_ * auVar17._0_4_;
    auVar179._8_4_ = auVar156._8_4_ * auVar156._8_4_ * auVar17._8_4_;
    auVar179._12_4_ = auVar156._12_4_ * auVar156._12_4_ * auVar17._12_4_;
    auVar179._16_4_ = auVar156._16_4_ * auVar156._16_4_ * 0.0;
    auVar179._20_4_ = auVar156._20_4_ * auVar156._20_4_ * 0.0;
    auVar179._24_4_ = auVar156._24_4_ * auVar156._24_4_ * 0.0;
    auVar179._28_4_ = auVar156._28_4_;
    auVar189._4_4_ = auVar97._4_4_ * auVar97._4_4_;
    auVar189._0_4_ = auVar97._0_4_ * auVar97._0_4_;
    auVar189._8_4_ = auVar97._8_4_ * auVar97._8_4_;
    auVar189._12_4_ = auVar97._12_4_ * auVar97._12_4_;
    auVar189._16_4_ = auVar97._16_4_ * auVar97._16_4_;
    auVar189._20_4_ = auVar97._20_4_ * auVar97._20_4_;
    auVar189._24_4_ = auVar97._24_4_ * auVar97._24_4_;
    auVar189._28_4_ = auVar97._28_4_;
    auVar156 = vcmpps_avx(auVar189,auVar179,2);
    fVar128 = auVar16._0_4_ * 4.7683716e-07;
    local_740._0_16_ = ZEXT416((uint)fVar128);
    auVar98._0_4_ = (float)iVar13;
    register0x000014c4 = auVar92._4_12_;
    auVar98._4_4_ = auVar98._0_4_;
    auVar98._8_4_ = auVar98._0_4_;
    auVar98._12_4_ = auVar98._0_4_;
    auVar98._16_4_ = auVar98._0_4_;
    auVar98._20_4_ = auVar98._0_4_;
    auVar98._24_4_ = auVar98._0_4_;
    auVar98._28_4_ = auVar98._0_4_;
    auVar97 = vcmpps_avx(_DAT_01f7b060,auVar98,1);
    auVar17 = vpermilps_avx(auVar21,0xaa);
    uVar89 = auVar17._0_8_;
    local_4a0._8_8_ = uVar89;
    local_4a0._0_8_ = uVar89;
    local_4a0._16_8_ = uVar89;
    local_4a0._24_8_ = uVar89;
    auVar18 = vpermilps_avx(auVar93,0xaa);
    uVar89 = auVar18._0_8_;
    local_480._8_8_ = uVar89;
    local_480._0_8_ = uVar89;
    local_480._16_8_ = uVar89;
    local_480._24_8_ = uVar89;
    auVar16 = vshufps_avx(auVar92,auVar92,0xaa);
    uVar89 = auVar16._0_8_;
    local_240._8_8_ = uVar89;
    local_240._0_8_ = uVar89;
    local_240._16_8_ = uVar89;
    local_240._24_8_ = uVar89;
    auVar16 = vshufps_avx(auVar129,auVar129,0xaa);
    uVar89 = auVar16._0_8_;
    register0x00001508 = uVar89;
    local_560 = uVar89;
    register0x00001510 = uVar89;
    register0x00001518 = uVar89;
    auVar23 = auVar97 & auVar156;
    uVar7 = *(uint *)(ray + k * 4 + 0x30);
    local_520._0_16_ = ZEXT416(uVar7);
    local_590 = ZEXT416(uVar12);
    fVar105 = fVar202;
    fVar107 = fVar207;
    fVar109 = fVar202;
    fVar212 = fVar207;
    fVar214 = fVar202;
    fVar216 = fVar207;
    uStack_6f8 = local_700;
    uStack_6f0 = local_700;
    uStack_6e8 = local_700;
    local_580._0_4_ = auVar98._0_4_;
    local_590._0_4_ = uVar12;
    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar23 >> 0x7f,0) == '\0') &&
          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar23 >> 0xbf,0) == '\0') &&
        (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar23[0x1f]) {
LAB_0117abda:
      auVar217 = ZEXT3264(local_720);
      auVar200 = ZEXT3264(_local_560);
      auVar193 = ZEXT3264(local_6e0);
      auVar190 = ZEXT3264(local_6c0);
      auVar183 = ZEXT3264(local_760);
      uVar84 = 0;
      auVar170 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,CONCAT416(fVar194,
                                                  CONCAT412(fVar194,CONCAT48(fVar194,CONCAT44(
                                                  fVar194,fVar194))))))));
      auVar143 = ZEXT3264(local_660);
      auVar127 = ZEXT3264(local_6a0);
      auVar176 = ZEXT3264(local_680);
    }
    else {
      _local_380 = vandps_avx(auVar156,auVar97);
      fVar195 = auVar16._0_4_;
      fVar201 = auVar16._4_4_;
      auVar22._4_4_ = fVar201 * fStack_33c;
      auVar22._0_4_ = fVar195 * local_340;
      auVar22._8_4_ = fVar195 * fStack_338;
      auVar22._12_4_ = fVar201 * fStack_334;
      auVar22._16_4_ = fVar195 * fStack_330;
      auVar22._20_4_ = fVar201 * fStack_32c;
      auVar22._24_4_ = fVar195 * fStack_328;
      auVar22._28_4_ = local_380._28_4_;
      auVar16 = vfmadd213ps_fma(auVar103,local_240,auVar22);
      auVar16 = vfmadd213ps_fma(auVar123,local_480,ZEXT1632(auVar16));
      auVar16 = vfmadd213ps_fma(auVar10,local_4a0,ZEXT1632(auVar16));
      local_320._0_4_ = auVar78._0_4_;
      local_320._4_4_ = auVar78._4_4_;
      fStack_318 = auVar78._8_4_;
      fStack_314 = auVar78._12_4_;
      fStack_310 = auVar78._16_4_;
      fStack_30c = auVar78._20_4_;
      fStack_308 = auVar78._24_4_;
      auVar99._0_4_ = fVar195 * (float)local_320._0_4_;
      auVar99._4_4_ = fVar201 * (float)local_320._4_4_;
      auVar99._8_4_ = fVar195 * fStack_318;
      auVar99._12_4_ = fVar201 * fStack_314;
      auVar99._16_4_ = fVar195 * fStack_310;
      auVar99._20_4_ = fVar201 * fStack_30c;
      auVar99._24_4_ = fVar195 * fStack_308;
      auVar99._28_4_ = 0;
      auVar21 = vfmadd213ps_fma(auVar165,local_240,auVar99);
      auVar21 = vfmadd213ps_fma(auVar125,local_480,ZEXT1632(auVar21));
      auVar125 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar87 + 0x1210);
      auVar165 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar87 + 0x1694);
      auVar103 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar87 + 0x1b18);
      fVar106 = *(float *)(catmullrom_basis0 + lVar87 + 0x1f9c);
      fVar108 = *(float *)(catmullrom_basis0 + lVar87 + 0x1fa0);
      fVar110 = *(float *)(catmullrom_basis0 + lVar87 + 0x1fa4);
      fVar111 = *(float *)(catmullrom_basis0 + lVar87 + 0x1fa8);
      fVar112 = *(float *)(catmullrom_basis0 + lVar87 + 0x1fac);
      fVar113 = *(float *)(catmullrom_basis0 + lVar87 + 0x1fb0);
      fVar211 = *(float *)(catmullrom_basis0 + lVar87 + 0x1fb4);
      auVar155._0_4_ = fVar194 * fVar106;
      auVar155._4_4_ = fVar194 * fVar108;
      auVar155._8_4_ = fVar194 * fVar110;
      auVar155._12_4_ = fVar194 * fVar111;
      auVar155._16_4_ = fVar194 * fVar112;
      auVar155._20_4_ = fVar194 * fVar113;
      auVar155._24_4_ = fVar194 * fVar211;
      auVar155._28_4_ = 0;
      auVar166._4_4_ = fVar207 * fVar108;
      auVar166._0_4_ = fVar202 * fVar106;
      auVar166._8_4_ = fVar202 * fVar110;
      auVar166._12_4_ = fVar207 * fVar111;
      auVar166._16_4_ = fVar202 * fVar112;
      auVar166._20_4_ = fVar207 * fVar113;
      auVar166._24_4_ = fVar202 * fVar211;
      auVar166._28_4_ = auVar18._4_4_;
      auVar186._0_4_ = fVar195 * fVar106;
      auVar186._4_4_ = fVar201 * fVar108;
      auVar186._8_4_ = fVar195 * fVar110;
      auVar186._12_4_ = fVar201 * fVar111;
      auVar186._16_4_ = fVar195 * fVar112;
      auVar186._20_4_ = fVar201 * fVar113;
      auVar186._24_4_ = fVar195 * fVar211;
      auVar186._28_4_ = 0;
      auVar18 = vfmadd231ps_fma(auVar155,auVar103,local_6c0);
      auVar93 = vfmadd231ps_fma(auVar166,auVar103,local_660);
      auVar92 = vfmadd231ps_fma(auVar186,local_240,auVar103);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar165,local_720);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar165,local_6a0);
      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar165,local_480);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar125,local_680);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar125,local_4c0);
      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_4a0,auVar125);
      fVar106 = *(float *)(catmullrom_basis1 + lVar87 + 0x1f9c);
      fVar108 = *(float *)(catmullrom_basis1 + lVar87 + 0x1fa0);
      fVar110 = *(float *)(catmullrom_basis1 + lVar87 + 0x1fa4);
      fVar111 = *(float *)(catmullrom_basis1 + lVar87 + 0x1fa8);
      fVar112 = *(float *)(catmullrom_basis1 + lVar87 + 0x1fac);
      fVar113 = *(float *)(catmullrom_basis1 + lVar87 + 0x1fb0);
      fVar211 = *(float *)(catmullrom_basis1 + lVar87 + 0x1fb4);
      auVar165._4_4_ = fVar194 * fVar108;
      auVar165._0_4_ = fVar194 * fVar106;
      auVar165._8_4_ = fVar194 * fVar110;
      auVar165._12_4_ = fVar194 * fVar111;
      auVar165._16_4_ = fVar194 * fVar112;
      auVar165._20_4_ = fVar194 * fVar113;
      auVar165._24_4_ = fVar194 * fVar211;
      auVar165._28_4_ = auVar125._28_4_;
      auVar24._4_4_ = fVar207 * fVar108;
      auVar24._0_4_ = fVar202 * fVar106;
      auVar24._8_4_ = fVar202 * fVar110;
      auVar24._12_4_ = fVar207 * fVar111;
      auVar24._16_4_ = fVar202 * fVar112;
      auVar24._20_4_ = fVar207 * fVar113;
      auVar24._24_4_ = fVar202 * fVar211;
      auVar24._28_4_ = fVar201;
      auVar25._4_4_ = fVar201 * fVar108;
      auVar25._0_4_ = fVar195 * fVar106;
      auVar25._8_4_ = fVar195 * fVar110;
      auVar25._12_4_ = fVar201 * fVar111;
      auVar25._16_4_ = fVar195 * fVar112;
      auVar25._20_4_ = fVar201 * fVar113;
      auVar25._24_4_ = fVar195 * fVar211;
      auVar25._28_4_ = auVar17._4_4_;
      auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar87 + 0x1b18);
      auVar17 = vfmadd231ps_fma(auVar165,auVar125,local_6c0);
      auVar129 = vfmadd231ps_fma(auVar24,auVar125,local_660);
      auVar115 = vfmadd231ps_fma(auVar25,auVar125,local_240);
      auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar87 + 0x1694);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar125,local_720);
      auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar125,local_6a0);
      auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),local_480,auVar125);
      auVar125 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar87 + 0x1210);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar125,local_680);
      auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar125,local_4c0);
      auVar120._8_4_ = 0x7fffffff;
      auVar120._0_8_ = 0x7fffffff7fffffff;
      auVar120._12_4_ = 0x7fffffff;
      auVar120._16_4_ = 0x7fffffff;
      auVar120._20_4_ = 0x7fffffff;
      auVar120._24_4_ = 0x7fffffff;
      auVar120._28_4_ = 0x7fffffff;
      auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),local_4a0,auVar125);
      auVar125 = vandps_avx(ZEXT1632(auVar18),auVar120);
      auVar165 = vandps_avx(ZEXT1632(auVar93),auVar120);
      auVar165 = vmaxps_avx(auVar125,auVar165);
      auVar125 = vandps_avx(ZEXT1632(auVar92),auVar120);
      auVar125 = vmaxps_avx(auVar165,auVar125);
      auVar136._4_4_ = fVar128;
      auVar136._0_4_ = fVar128;
      auVar136._8_4_ = fVar128;
      auVar136._12_4_ = fVar128;
      auVar136._16_4_ = fVar128;
      auVar136._20_4_ = fVar128;
      auVar136._24_4_ = fVar128;
      auVar136._28_4_ = fVar128;
      auVar125 = vcmpps_avx(auVar125,auVar136,1);
      auVar103 = vblendvps_avx(ZEXT1632(auVar18),auVar104,auVar125);
      auVar123 = vblendvps_avx(ZEXT1632(auVar93),local_360,auVar125);
      auVar125 = vandps_avx(ZEXT1632(auVar17),auVar120);
      auVar165 = vandps_avx(ZEXT1632(auVar129),auVar120);
      auVar10 = vmaxps_avx(auVar125,auVar165);
      auVar125 = vandps_avx(ZEXT1632(auVar115),auVar120);
      auVar125 = vmaxps_avx(auVar10,auVar125);
      auVar156 = vcmpps_avx(auVar125,auVar136,1);
      auVar125 = vblendvps_avx(ZEXT1632(auVar17),auVar104,auVar156);
      auVar10 = vblendvps_avx(ZEXT1632(auVar129),local_360,auVar156);
      auVar17 = vfmadd213ps_fma(auVar95,local_4a0,ZEXT1632(auVar21));
      auVar18 = vfmadd213ps_fma(auVar103,auVar103,ZEXT832(0) << 0x20);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar123,auVar123);
      auVar95 = vrsqrtps_avx(ZEXT1632(auVar18));
      fVar128 = auVar95._0_4_;
      fVar106 = auVar95._4_4_;
      fVar108 = auVar95._8_4_;
      fVar110 = auVar95._12_4_;
      fVar111 = auVar95._16_4_;
      fVar112 = auVar95._20_4_;
      fVar113 = auVar95._24_4_;
      auVar104._4_4_ = fVar106 * fVar106 * fVar106 * auVar18._4_4_ * -0.5;
      auVar104._0_4_ = fVar128 * fVar128 * fVar128 * auVar18._0_4_ * -0.5;
      auVar104._8_4_ = fVar108 * fVar108 * fVar108 * auVar18._8_4_ * -0.5;
      auVar104._12_4_ = fVar110 * fVar110 * fVar110 * auVar18._12_4_ * -0.5;
      auVar104._16_4_ = fVar111 * fVar111 * fVar111 * -0.0;
      auVar104._20_4_ = fVar112 * fVar112 * fVar112 * -0.0;
      auVar104._24_4_ = fVar113 * fVar113 * fVar113 * -0.0;
      auVar104._28_4_ = auVar165._28_4_;
      auVar205._8_4_ = 0x3fc00000;
      auVar205._0_8_ = 0x3fc000003fc00000;
      auVar205._12_4_ = 0x3fc00000;
      auVar205._16_4_ = 0x3fc00000;
      auVar205._20_4_ = 0x3fc00000;
      auVar205._24_4_ = 0x3fc00000;
      auVar205._28_4_ = 0x3fc00000;
      auVar18 = vfmadd231ps_fma(auVar104,auVar205,auVar95);
      fVar128 = auVar18._0_4_;
      fVar106 = auVar18._4_4_;
      auVar26._4_4_ = fVar106 * auVar123._4_4_;
      auVar26._0_4_ = fVar128 * auVar123._0_4_;
      fVar108 = auVar18._8_4_;
      auVar26._8_4_ = fVar108 * auVar123._8_4_;
      fVar110 = auVar18._12_4_;
      auVar26._12_4_ = fVar110 * auVar123._12_4_;
      auVar26._16_4_ = auVar123._16_4_ * 0.0;
      auVar26._20_4_ = auVar123._20_4_ * 0.0;
      auVar26._24_4_ = auVar123._24_4_ * 0.0;
      auVar26._28_4_ = 0;
      auVar27._4_4_ = fVar106 * -auVar103._4_4_;
      auVar27._0_4_ = fVar128 * -auVar103._0_4_;
      auVar27._8_4_ = fVar108 * -auVar103._8_4_;
      auVar27._12_4_ = fVar110 * -auVar103._12_4_;
      auVar27._16_4_ = -auVar103._16_4_ * 0.0;
      auVar27._20_4_ = -auVar103._20_4_ * 0.0;
      auVar27._24_4_ = -auVar103._24_4_ * 0.0;
      auVar27._28_4_ = auVar95._28_4_;
      auVar18 = vfmadd213ps_fma(auVar125,auVar125,ZEXT832(0) << 0x20);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar10,auVar10);
      auVar165 = vrsqrtps_avx(ZEXT1632(auVar18));
      auVar28._28_4_ = auVar156._28_4_;
      auVar28._0_28_ =
           ZEXT1628(CONCAT412(fVar110 * 0.0,
                              CONCAT48(fVar108 * 0.0,CONCAT44(fVar106 * 0.0,fVar128 * 0.0))));
      fVar128 = auVar165._0_4_;
      fVar106 = auVar165._4_4_;
      fVar108 = auVar165._8_4_;
      fVar110 = auVar165._12_4_;
      fVar111 = auVar165._16_4_;
      fVar112 = auVar165._20_4_;
      fVar113 = auVar165._24_4_;
      auVar29._4_4_ = fVar106 * fVar106 * fVar106 * auVar18._4_4_ * -0.5;
      auVar29._0_4_ = fVar128 * fVar128 * fVar128 * auVar18._0_4_ * -0.5;
      auVar29._8_4_ = fVar108 * fVar108 * fVar108 * auVar18._8_4_ * -0.5;
      auVar29._12_4_ = fVar110 * fVar110 * fVar110 * auVar18._12_4_ * -0.5;
      auVar29._16_4_ = fVar111 * fVar111 * fVar111 * -0.0;
      auVar29._20_4_ = fVar112 * fVar112 * fVar112 * -0.0;
      auVar29._24_4_ = fVar113 * fVar113 * fVar113 * -0.0;
      auVar29._28_4_ = 0;
      auVar18 = vfmadd231ps_fma(auVar29,auVar205,auVar165);
      fVar128 = auVar18._0_4_;
      auVar187._0_4_ = auVar10._0_4_ * fVar128;
      fVar106 = auVar18._4_4_;
      auVar187._4_4_ = auVar10._4_4_ * fVar106;
      fVar108 = auVar18._8_4_;
      auVar187._8_4_ = auVar10._8_4_ * fVar108;
      fVar110 = auVar18._12_4_;
      auVar187._12_4_ = auVar10._12_4_ * fVar110;
      auVar187._16_4_ = auVar10._16_4_ * 0.0;
      auVar187._20_4_ = auVar10._20_4_ * 0.0;
      auVar187._24_4_ = auVar10._24_4_ * 0.0;
      auVar187._28_4_ = 0;
      auVar30._4_4_ = -auVar125._4_4_ * fVar106;
      auVar30._0_4_ = -auVar125._0_4_ * fVar128;
      auVar30._8_4_ = -auVar125._8_4_ * fVar108;
      auVar30._12_4_ = -auVar125._12_4_ * fVar110;
      auVar30._16_4_ = -auVar125._16_4_ * 0.0;
      auVar30._20_4_ = -auVar125._20_4_ * 0.0;
      auVar30._24_4_ = -auVar125._24_4_ * 0.0;
      auVar30._28_4_ = auVar10._28_4_;
      auVar125._28_4_ = auVar165._28_4_;
      auVar125._0_28_ =
           ZEXT1628(CONCAT412(fVar110 * 0.0,
                              CONCAT48(fVar108 * 0.0,CONCAT44(fVar106 * 0.0,fVar128 * 0.0))));
      auVar18 = vfmadd213ps_fma(auVar26,ZEXT1632(auVar19),local_300);
      auVar165 = ZEXT1632(auVar19);
      auVar21 = vfmadd213ps_fma(auVar27,auVar165,auVar96);
      auVar93 = vfmadd213ps_fma(auVar28,auVar165,ZEXT1632(auVar17));
      auVar115 = vfnmadd213ps_fma(auVar26,auVar165,local_300);
      auVar92 = vfmadd213ps_fma(auVar187,ZEXT1632(auVar20),local_2c0);
      auVar91 = vfnmadd213ps_fma(auVar27,auVar165,auVar96);
      auVar165 = ZEXT1632(auVar20);
      auVar129 = vfmadd213ps_fma(auVar30,auVar165,_local_2e0);
      auVar166 = ZEXT1632(auVar19);
      auVar145 = vfnmadd231ps_fma(ZEXT1632(auVar17),auVar166,auVar28);
      auVar17 = vfmadd213ps_fma(auVar125,auVar165,ZEXT1632(auVar16));
      auVar116 = vfnmadd213ps_fma(auVar187,auVar165,local_2c0);
      auVar139 = vfnmadd213ps_fma(auVar30,auVar165,_local_2e0);
      auVar90 = vfnmadd231ps_fma(ZEXT1632(auVar16),ZEXT1632(auVar20),auVar125);
      auVar125 = vsubps_avx(ZEXT1632(auVar129),ZEXT1632(auVar91));
      auVar165 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar145));
      auVar96._4_4_ = auVar145._4_4_ * auVar125._4_4_;
      auVar96._0_4_ = auVar145._0_4_ * auVar125._0_4_;
      auVar96._8_4_ = auVar145._8_4_ * auVar125._8_4_;
      auVar96._12_4_ = auVar145._12_4_ * auVar125._12_4_;
      auVar96._16_4_ = auVar125._16_4_ * 0.0;
      auVar96._20_4_ = auVar125._20_4_ * 0.0;
      auVar96._24_4_ = auVar125._24_4_ * 0.0;
      auVar96._28_4_ = 0;
      auVar19 = vfmsub231ps_fma(auVar96,ZEXT1632(auVar91),auVar165);
      auVar31._4_4_ = auVar165._4_4_ * auVar115._4_4_;
      auVar31._0_4_ = auVar165._0_4_ * auVar115._0_4_;
      auVar31._8_4_ = auVar165._8_4_ * auVar115._8_4_;
      auVar31._12_4_ = auVar165._12_4_ * auVar115._12_4_;
      auVar31._16_4_ = auVar165._16_4_ * 0.0;
      auVar31._20_4_ = auVar165._20_4_ * 0.0;
      auVar31._24_4_ = auVar165._24_4_ * 0.0;
      auVar31._28_4_ = auVar165._28_4_;
      auVar165 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar115));
      auVar16 = vfmsub231ps_fma(auVar31,ZEXT1632(auVar145),auVar165);
      auVar32._4_4_ = auVar91._4_4_ * auVar165._4_4_;
      auVar32._0_4_ = auVar91._0_4_ * auVar165._0_4_;
      auVar32._8_4_ = auVar91._8_4_ * auVar165._8_4_;
      auVar32._12_4_ = auVar91._12_4_ * auVar165._12_4_;
      auVar32._16_4_ = auVar165._16_4_ * 0.0;
      auVar32._20_4_ = auVar165._20_4_ * 0.0;
      auVar32._24_4_ = auVar165._24_4_ * 0.0;
      auVar32._28_4_ = auVar165._28_4_;
      auVar156 = ZEXT1632(auVar115);
      auVar115 = vfmsub231ps_fma(auVar32,auVar156,auVar125);
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar115),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
      auVar23 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,2);
      auVar125 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar18),auVar23);
      auVar165 = vblendvps_avx(ZEXT1632(auVar139),ZEXT1632(auVar21),auVar23);
      auVar95 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar93),auVar23);
      auVar103 = vblendvps_avx(auVar156,ZEXT1632(auVar92),auVar23);
      auVar123 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar129),auVar23);
      auVar10 = vblendvps_avx(ZEXT1632(auVar145),ZEXT1632(auVar17),auVar23);
      auVar156 = vblendvps_avx(ZEXT1632(auVar92),auVar156,auVar23);
      auVar97 = vblendvps_avx(ZEXT1632(auVar129),ZEXT1632(auVar91),auVar23);
      auVar16 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
      auVar104 = vblendvps_avx(ZEXT1632(auVar17),ZEXT1632(auVar145),auVar23);
      auVar179 = vsubps_avx(auVar156,auVar125);
      auVar189 = vsubps_avx(auVar97,auVar165);
      auVar96 = vsubps_avx(auVar104,auVar95);
      auVar119 = vsubps_avx(auVar125,auVar103);
      auVar164 = vsubps_avx(auVar165,auVar123);
      auVar22 = vsubps_avx(auVar95,auVar10);
      auVar33._4_4_ = auVar96._4_4_ * auVar125._4_4_;
      auVar33._0_4_ = auVar96._0_4_ * auVar125._0_4_;
      auVar33._8_4_ = auVar96._8_4_ * auVar125._8_4_;
      auVar33._12_4_ = auVar96._12_4_ * auVar125._12_4_;
      auVar33._16_4_ = auVar96._16_4_ * auVar125._16_4_;
      auVar33._20_4_ = auVar96._20_4_ * auVar125._20_4_;
      auVar33._24_4_ = auVar96._24_4_ * auVar125._24_4_;
      auVar33._28_4_ = auVar104._28_4_;
      auVar17 = vfmsub231ps_fma(auVar33,auVar95,auVar179);
      auVar34._4_4_ = auVar179._4_4_ * auVar165._4_4_;
      auVar34._0_4_ = auVar179._0_4_ * auVar165._0_4_;
      auVar34._8_4_ = auVar179._8_4_ * auVar165._8_4_;
      auVar34._12_4_ = auVar179._12_4_ * auVar165._12_4_;
      auVar34._16_4_ = auVar179._16_4_ * auVar165._16_4_;
      auVar34._20_4_ = auVar179._20_4_ * auVar165._20_4_;
      auVar34._24_4_ = auVar179._24_4_ * auVar165._24_4_;
      auVar34._28_4_ = auVar156._28_4_;
      auVar18 = vfmsub231ps_fma(auVar34,auVar125,auVar189);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
      auVar100._0_4_ = auVar189._0_4_ * auVar95._0_4_;
      auVar100._4_4_ = auVar189._4_4_ * auVar95._4_4_;
      auVar100._8_4_ = auVar189._8_4_ * auVar95._8_4_;
      auVar100._12_4_ = auVar189._12_4_ * auVar95._12_4_;
      auVar100._16_4_ = auVar189._16_4_ * auVar95._16_4_;
      auVar100._20_4_ = auVar189._20_4_ * auVar95._20_4_;
      auVar100._24_4_ = auVar189._24_4_ * auVar95._24_4_;
      auVar100._28_4_ = 0;
      auVar18 = vfmsub231ps_fma(auVar100,auVar165,auVar96);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
      auVar101._0_4_ = auVar22._0_4_ * auVar103._0_4_;
      auVar101._4_4_ = auVar22._4_4_ * auVar103._4_4_;
      auVar101._8_4_ = auVar22._8_4_ * auVar103._8_4_;
      auVar101._12_4_ = auVar22._12_4_ * auVar103._12_4_;
      auVar101._16_4_ = auVar22._16_4_ * auVar103._16_4_;
      auVar101._20_4_ = auVar22._20_4_ * auVar103._20_4_;
      auVar101._24_4_ = auVar22._24_4_ * auVar103._24_4_;
      auVar101._28_4_ = 0;
      auVar17 = vfmsub231ps_fma(auVar101,auVar119,auVar10);
      auVar35._4_4_ = auVar164._4_4_ * auVar10._4_4_;
      auVar35._0_4_ = auVar164._0_4_ * auVar10._0_4_;
      auVar35._8_4_ = auVar164._8_4_ * auVar10._8_4_;
      auVar35._12_4_ = auVar164._12_4_ * auVar10._12_4_;
      auVar35._16_4_ = auVar164._16_4_ * auVar10._16_4_;
      auVar35._20_4_ = auVar164._20_4_ * auVar10._20_4_;
      auVar35._24_4_ = auVar164._24_4_ * auVar10._24_4_;
      auVar35._28_4_ = auVar10._28_4_;
      auVar19 = vfmsub231ps_fma(auVar35,auVar123,auVar22);
      auVar36._4_4_ = auVar119._4_4_ * auVar123._4_4_;
      auVar36._0_4_ = auVar119._0_4_ * auVar123._0_4_;
      auVar36._8_4_ = auVar119._8_4_ * auVar123._8_4_;
      auVar36._12_4_ = auVar119._12_4_ * auVar123._12_4_;
      auVar36._16_4_ = auVar119._16_4_ * auVar123._16_4_;
      auVar36._20_4_ = auVar119._20_4_ * auVar123._20_4_;
      auVar36._24_4_ = auVar119._24_4_ * auVar123._24_4_;
      auVar36._28_4_ = auVar97._28_4_;
      auVar21 = vfmsub231ps_fma(auVar36,auVar164,auVar103);
      auVar17 = vfmadd231ps_fma(ZEXT1632(auVar21),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
      auVar160 = ZEXT1664(auVar19);
      auVar103 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar19));
      auVar103 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,2);
      auVar17 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
      auVar16 = vpand_avx(auVar17,auVar16);
      auVar103 = vpmovsxwd_avx2(auVar16);
      if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar103 >> 0x7f,0) == '\0') &&
            (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar103 >> 0xbf,0) == '\0') &&
          (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar103[0x1f]) {
LAB_0117bfea:
        auVar176 = ZEXT3264(CONCAT824(uStack_4c8,
                                      CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
      }
      else {
        auVar37._4_4_ = auVar189._4_4_ * auVar22._4_4_;
        auVar37._0_4_ = auVar189._0_4_ * auVar22._0_4_;
        auVar37._8_4_ = auVar189._8_4_ * auVar22._8_4_;
        auVar37._12_4_ = auVar189._12_4_ * auVar22._12_4_;
        auVar37._16_4_ = auVar189._16_4_ * auVar22._16_4_;
        auVar37._20_4_ = auVar189._20_4_ * auVar22._20_4_;
        auVar37._24_4_ = auVar189._24_4_ * auVar22._24_4_;
        auVar37._28_4_ = auVar103._28_4_;
        auVar92 = vfmsub231ps_fma(auVar37,auVar164,auVar96);
        auVar121._0_4_ = auVar96._0_4_ * auVar119._0_4_;
        auVar121._4_4_ = auVar96._4_4_ * auVar119._4_4_;
        auVar121._8_4_ = auVar96._8_4_ * auVar119._8_4_;
        auVar121._12_4_ = auVar96._12_4_ * auVar119._12_4_;
        auVar121._16_4_ = auVar96._16_4_ * auVar119._16_4_;
        auVar121._20_4_ = auVar96._20_4_ * auVar119._20_4_;
        auVar121._24_4_ = auVar96._24_4_ * auVar119._24_4_;
        auVar121._28_4_ = 0;
        auVar93 = vfmsub231ps_fma(auVar121,auVar179,auVar22);
        auVar38._4_4_ = auVar179._4_4_ * auVar164._4_4_;
        auVar38._0_4_ = auVar179._0_4_ * auVar164._0_4_;
        auVar38._8_4_ = auVar179._8_4_ * auVar164._8_4_;
        auVar38._12_4_ = auVar179._12_4_ * auVar164._12_4_;
        auVar38._16_4_ = auVar179._16_4_ * auVar164._16_4_;
        auVar38._20_4_ = auVar179._20_4_ * auVar164._20_4_;
        auVar38._24_4_ = auVar179._24_4_ * auVar164._24_4_;
        auVar38._28_4_ = auVar123._28_4_;
        auVar129 = vfmsub231ps_fma(auVar38,auVar119,auVar189);
        auVar17 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar93),ZEXT1632(auVar129));
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT1632(auVar92),_DAT_01f7b000);
        auVar103 = vrcpps_avx(ZEXT1632(auVar21));
        auVar188._8_4_ = 0x3f800000;
        auVar188._0_8_ = 0x3f8000003f800000;
        auVar188._12_4_ = 0x3f800000;
        auVar188._16_4_ = 0x3f800000;
        auVar188._20_4_ = 0x3f800000;
        auVar188._24_4_ = 0x3f800000;
        auVar188._28_4_ = 0x3f800000;
        auVar17 = vfnmadd213ps_fma(auVar103,ZEXT1632(auVar21),auVar188);
        auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar103,auVar103);
        auVar167._0_4_ = auVar129._0_4_ * auVar95._0_4_;
        auVar167._4_4_ = auVar129._4_4_ * auVar95._4_4_;
        auVar167._8_4_ = auVar129._8_4_ * auVar95._8_4_;
        auVar167._12_4_ = auVar129._12_4_ * auVar95._12_4_;
        auVar167._16_4_ = auVar95._16_4_ * 0.0;
        auVar167._20_4_ = auVar95._20_4_ * 0.0;
        auVar167._24_4_ = auVar95._24_4_ * 0.0;
        auVar167._28_4_ = 0;
        auVar93 = vfmadd231ps_fma(auVar167,auVar165,ZEXT1632(auVar93));
        auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),ZEXT1632(auVar92),auVar125);
        fVar128 = auVar17._0_4_;
        fVar106 = auVar17._4_4_;
        fVar108 = auVar17._8_4_;
        fVar110 = auVar17._12_4_;
        auVar95 = ZEXT1632(CONCAT412(fVar110 * auVar93._12_4_,
                                     CONCAT48(fVar108 * auVar93._8_4_,
                                              CONCAT44(fVar106 * auVar93._4_4_,
                                                       fVar128 * auVar93._0_4_))));
        auVar102._4_4_ = uVar7;
        auVar102._0_4_ = uVar7;
        auVar102._8_4_ = uVar7;
        auVar102._12_4_ = uVar7;
        auVar102._16_4_ = uVar7;
        auVar102._20_4_ = uVar7;
        auVar102._24_4_ = uVar7;
        auVar102._28_4_ = uVar7;
        uVar86 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar122._4_4_ = uVar86;
        auVar122._0_4_ = uVar86;
        auVar122._8_4_ = uVar86;
        auVar122._12_4_ = uVar86;
        auVar122._16_4_ = uVar86;
        auVar122._20_4_ = uVar86;
        auVar122._24_4_ = uVar86;
        auVar122._28_4_ = uVar86;
        auVar125 = vcmpps_avx(auVar102,auVar95,2);
        auVar165 = vcmpps_avx(auVar95,auVar122,2);
        auVar125 = vandps_avx(auVar165,auVar125);
        auVar17 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
        auVar16 = vpand_avx(auVar16,auVar17);
        auVar125 = vpmovsxwd_avx2(auVar16);
        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar125 >> 0x7f,0) == '\0') &&
              (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar125 >> 0xbf,0) == '\0') &&
            (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar125[0x1f]) goto LAB_0117bfea;
        auVar125 = vcmpps_avx(ZEXT1632(auVar21),ZEXT832(0) << 0x20,4);
        auVar17 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
        auVar16 = vpand_avx(auVar16,auVar17);
        auVar125 = vpmovsxwd_avx2(auVar16);
        auVar176 = ZEXT3264(CONCAT824(uStack_4c8,
                                      CONCAT816(uStack_4d0,CONCAT88(uStack_4d8,local_4e0))));
        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar125 >> 0x7f,0) != '\0') ||
              (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar125 >> 0xbf,0) != '\0') ||
            (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar125[0x1f] < '\0') {
          auVar103 = ZEXT1632(CONCAT412(fVar110 * auVar18._12_4_,
                                        CONCAT48(fVar108 * auVar18._8_4_,
                                                 CONCAT44(fVar106 * auVar18._4_4_,
                                                          fVar128 * auVar18._0_4_))));
          auVar123 = ZEXT1632(CONCAT412(fVar110 * auVar19._12_4_,
                                        CONCAT48(fVar108 * auVar19._8_4_,
                                                 CONCAT44(fVar106 * auVar19._4_4_,
                                                          fVar128 * auVar19._0_4_))));
          auVar151._8_4_ = 0x3f800000;
          auVar151._0_8_ = 0x3f8000003f800000;
          auVar151._12_4_ = 0x3f800000;
          auVar151._16_4_ = 0x3f800000;
          auVar151._20_4_ = 0x3f800000;
          auVar151._24_4_ = 0x3f800000;
          auVar151._28_4_ = 0x3f800000;
          auVar165 = vsubps_avx(auVar151,auVar103);
          _local_260 = vblendvps_avx(auVar165,auVar103,auVar23);
          auVar165 = vsubps_avx(auVar151,auVar123);
          local_3a0 = vblendvps_avx(auVar165,auVar123,auVar23);
          auVar176 = ZEXT3264(auVar125);
          local_280 = auVar95;
        }
      }
      auVar217 = ZEXT3264(local_720);
      auVar200 = ZEXT3264(_local_560);
      auVar193 = ZEXT3264(local_6e0);
      auVar190 = ZEXT3264(local_6c0);
      auVar183 = ZEXT3264(local_760);
      auVar125 = auVar176._0_32_;
      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar125 >> 0x7f,0) == '\0') &&
            (auVar176 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
           SUB321(auVar125 >> 0xbf,0) == '\0') &&
          (auVar176 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
          -1 < auVar176[0x1f]) goto LAB_0117abda;
      auVar165 = vsubps_avx(ZEXT1632(auVar20),auVar166);
      auVar16 = vfmadd213ps_fma(auVar165,_local_260,auVar166);
      fVar128 = *(float *)((long)local_5f8->ray_space + k * 4 + -0x10);
      auVar39._4_4_ = (auVar16._4_4_ + auVar16._4_4_) * fVar128;
      auVar39._0_4_ = (auVar16._0_4_ + auVar16._0_4_) * fVar128;
      auVar39._8_4_ = (auVar16._8_4_ + auVar16._8_4_) * fVar128;
      auVar39._12_4_ = (auVar16._12_4_ + auVar16._12_4_) * fVar128;
      auVar39._16_4_ = fVar128 * 0.0;
      auVar39._20_4_ = fVar128 * 0.0;
      auVar39._24_4_ = fVar128 * 0.0;
      auVar39._28_4_ = 0;
      auVar165 = vcmpps_avx(local_280,auVar39,6);
      auVar95 = auVar125 & auVar165;
      auVar176 = ZEXT3264(local_680);
      if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar95 >> 0x7f,0) == '\0') &&
            (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar95 >> 0xbf,0) == '\0') &&
          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar95[0x1f])
      {
        uVar84 = 0;
        auVar127 = ZEXT3264(local_6a0);
        auVar143 = ZEXT3264(local_660);
        auVar170 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,CONCAT416(fVar194,
                                                  CONCAT412(fVar194,CONCAT48(fVar194,CONCAT44(
                                                  fVar194,fVar194))))))));
      }
      else {
        auVar124._8_4_ = 0xbf800000;
        auVar124._0_8_ = 0xbf800000bf800000;
        auVar124._12_4_ = 0xbf800000;
        auVar124._16_4_ = 0xbf800000;
        auVar124._20_4_ = 0xbf800000;
        auVar124._24_4_ = 0xbf800000;
        auVar124._28_4_ = 0xbf800000;
        auVar137._8_4_ = 0x40000000;
        auVar137._0_8_ = 0x4000000040000000;
        auVar137._12_4_ = 0x40000000;
        auVar137._16_4_ = 0x40000000;
        auVar137._20_4_ = 0x40000000;
        auVar137._24_4_ = 0x40000000;
        auVar137._28_4_ = 0x40000000;
        auVar16 = vfmadd213ps_fma(local_3a0,auVar137,auVar124);
        auVar160 = ZEXT1664(auVar16);
        local_220 = _local_260;
        local_200 = ZEXT1632(auVar16);
        local_1e0 = local_280;
        local_1c0 = 0;
        local_3a0 = local_200;
        if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar84 = 0;
          auVar143 = ZEXT3264(local_660);
          auVar170 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,CONCAT416(
                                                  fVar194,CONCAT412(fVar194,CONCAT48(fVar194,
                                                  CONCAT44(fVar194,fVar194))))))));
        }
        else {
          auVar143 = ZEXT3264(local_660);
          auVar170 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,CONCAT416(
                                                  fVar194,CONCAT412(fVar194,CONCAT48(fVar194,
                                                  CONCAT44(fVar194,fVar194))))))));
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (uVar84 = CONCAT71((int7)(uVar84 >> 8),1),
             pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar125 = vandps_avx(auVar165,auVar125);
            fVar128 = 1.0 / auVar98._0_4_;
            local_140[0] = fVar128 * ((float)local_260._0_4_ + 0.0);
            local_140[1] = fVar128 * ((float)local_260._4_4_ + 1.0);
            local_140[2] = fVar128 * (fStack_258 + 2.0);
            local_140[3] = fVar128 * (fStack_254 + 3.0);
            fStack_130 = fVar128 * (fStack_250 + 4.0);
            fStack_12c = fVar128 * (fStack_24c + 5.0);
            fStack_128 = fVar128 * (fStack_248 + 6.0);
            fStack_124 = fStack_244 + 7.0;
            local_3a0._0_8_ = auVar16._0_8_;
            local_3a0._8_8_ = auVar16._8_8_;
            local_120 = local_3a0._0_8_;
            uStack_118 = local_3a0._8_8_;
            uStack_110 = 0;
            uStack_108 = 0;
            local_100 = local_280;
            uVar86 = vmovmskps_avx(auVar125);
            uVar81 = 0;
            uVar85 = CONCAT44((int)(uVar84 >> 0x20),uVar86);
            for (uVar84 = uVar85; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
              uVar81 = uVar81 + 1;
            }
            local_5c0._0_16_ = CONCAT412(uVar79,CONCAT48(uVar79,CONCAT44(uVar79,uVar79)));
            local_5c0 = ZEXT1632(local_5c0._0_16_);
            local_540._0_8_ = CONCAT44(uVar12,uVar12);
            local_540 = ZEXT1632(CONCAT412(uVar12,CONCAT48(uVar12,local_540._0_8_)));
            _local_320 = *pauVar5;
            local_1bc = iVar13;
            local_1b0 = local_610;
            uStack_1a8 = uStack_608;
            local_1a0 = local_620;
            uStack_198 = uStack_618;
            local_190 = local_630;
            uStack_188 = uStack_628;
            while (uVar85 != 0) {
              uVar86 = *(undefined4 *)(ray + k * 4 + 0x80);
              fVar128 = local_140[uVar81];
              local_420._4_4_ = fVar128;
              local_420._0_4_ = fVar128;
              local_420._8_4_ = fVar128;
              local_420._12_4_ = fVar128;
              local_410 = *(undefined4 *)((long)&local_120 + uVar81 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_100 + uVar81 * 4);
              fVar106 = 1.0 - fVar128;
              auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,ZEXT416(0xc0a00000)
                                       );
              auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar128 * fVar128 * 3.0)),
                                        ZEXT416((uint)(fVar128 + fVar128)),auVar16);
              auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,ZEXT416(0x40000000)
                                       );
              auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar106 * fVar106 * -3.0)),
                                        ZEXT416((uint)(fVar106 + fVar106)),auVar16);
              auVar160 = ZEXT1664(auVar18);
              auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar128 * (fVar106 + fVar106))),
                                         ZEXT416((uint)fVar106),ZEXT416((uint)fVar106));
              auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar128 * fVar128)),local_420,
                                        ZEXT416((uint)(fVar106 * -2.0)));
              fVar128 = auVar18._0_4_ * 0.5;
              fVar106 = auVar16._0_4_ * 0.5;
              auVar147._0_4_ = fVar106 * local_570;
              auVar147._4_4_ = fVar106 * fStack_56c;
              auVar147._8_4_ = fVar106 * fStack_568;
              auVar147._12_4_ = fVar106 * fStack_564;
              auVar130._4_4_ = fVar128;
              auVar130._0_4_ = fVar128;
              auVar130._8_4_ = fVar128;
              auVar130._12_4_ = fVar128;
              auVar69._8_8_ = uStack_628;
              auVar69._0_8_ = local_630;
              auVar16 = vfmadd132ps_fma(auVar130,auVar147,auVar69);
              fVar128 = auVar17._0_4_ * 0.5;
              auVar148._4_4_ = fVar128;
              auVar148._0_4_ = fVar128;
              auVar148._8_4_ = fVar128;
              auVar148._12_4_ = fVar128;
              auVar71._8_8_ = uStack_618;
              auVar71._0_8_ = local_620;
              auVar16 = vfmadd132ps_fma(auVar148,auVar16,auVar71);
              local_5f0.context = context->user;
              fVar128 = auVar19._0_4_ * 0.5;
              auVar131._4_4_ = fVar128;
              auVar131._0_4_ = fVar128;
              auVar131._8_4_ = fVar128;
              auVar131._12_4_ = fVar128;
              auVar73._8_8_ = uStack_608;
              auVar73._0_8_ = local_610;
              auVar16 = vfmadd132ps_fma(auVar131,auVar16,auVar73);
              local_450 = auVar16._0_4_;
              local_440 = vshufps_avx(auVar16,auVar16,0x55);
              local_430 = vshufps_avx(auVar16,auVar16,0xaa);
              local_400 = local_540._0_8_;
              uStack_3f8 = local_540._8_8_;
              local_3f0 = local_5c0._0_16_;
              vpcmpeqd_avx2(ZEXT1632(local_5c0._0_16_),ZEXT1632(local_5c0._0_16_));
              uStack_3dc = (local_5f0.context)->instID[0];
              local_3e0 = uStack_3dc;
              uStack_3d8 = uStack_3dc;
              uStack_3d4 = uStack_3dc;
              uStack_3d0 = (local_5f0.context)->instPrimID[0];
              uStack_3cc = uStack_3d0;
              uStack_3c8 = uStack_3d0;
              uStack_3c4 = uStack_3d0;
              local_780 = *local_600;
              local_5f0.valid = (int *)local_780;
              local_5f0.geometryUserPtr = pGVar14->userPtr;
              local_5f0.hit = (RTCHitN *)&local_450;
              local_5f0.N = 4;
              local_5f0.ray = (RTCRayN *)ray;
              uStack_44c = local_450;
              uStack_448 = local_450;
              uStack_444 = local_450;
              uStack_40c = local_410;
              uStack_408 = local_410;
              uStack_404 = local_410;
              if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar160 = ZEXT1664(auVar18);
                (*pGVar14->occlusionFilterN)(&local_5f0);
                auVar200 = ZEXT3264(_local_560);
                auVar176 = ZEXT3264(local_680);
                auVar217 = ZEXT3264(local_720);
                auVar190 = ZEXT3264(local_6c0);
                auVar183 = ZEXT3264(local_760);
                auVar193 = ZEXT3264(local_6e0);
                fVar202 = (float)local_700;
                fVar207 = local_700._4_4_;
                fVar105 = (float)uStack_6f8;
                fVar107 = uStack_6f8._4_4_;
                fVar109 = (float)uStack_6f0;
                fVar212 = uStack_6f0._4_4_;
                fVar214 = (float)uStack_6e8;
                fVar216 = uStack_6e8._4_4_;
              }
              if (local_780 == (undefined1  [16])0x0) {
                auVar16 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar16 = auVar16 ^ _DAT_01f46b70;
                auVar143 = ZEXT3264(local_660);
                auVar170 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,CONCAT416(
                                                  fVar194,CONCAT412(fVar194,CONCAT48(fVar194,
                                                  CONCAT44(fVar194,fVar194))))))));
              }
              else {
                p_Var15 = context->args->filter;
                if (p_Var15 == (RTCFilterFunctionN)0x0) {
                  auVar143 = ZEXT3264(local_660);
                  auVar170 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,
                                                  CONCAT416(fVar194,CONCAT412(fVar194,CONCAT48(
                                                  fVar194,CONCAT44(fVar194,fVar194))))))));
                }
                else {
                  auVar143 = ZEXT3264(local_660);
                  auVar170 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,
                                                  CONCAT416(fVar194,CONCAT412(fVar194,CONCAT48(
                                                  fVar194,CONCAT44(fVar194,fVar194))))))));
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     (((pGVar14->field_8).field_0x2 & 0x40) != 0)) {
                    auVar160 = ZEXT1664(auVar160._0_16_);
                    (*p_Var15)(&local_5f0);
                    auVar200 = ZEXT3264(_local_560);
                    auVar176 = ZEXT3264(local_680);
                    auVar217 = ZEXT3264(local_720);
                    auVar170 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,
                                                  CONCAT416(fVar194,CONCAT412(fVar194,CONCAT48(
                                                  fVar194,CONCAT44(fVar194,fVar194))))))));
                    auVar143 = ZEXT3264(local_660);
                    auVar190 = ZEXT3264(local_6c0);
                    auVar183 = ZEXT3264(local_760);
                    auVar193 = ZEXT3264(local_6e0);
                    fVar202 = (float)local_700;
                    fVar207 = local_700._4_4_;
                    fVar105 = (float)uStack_6f8;
                    fVar107 = uStack_6f8._4_4_;
                    fVar109 = (float)uStack_6f0;
                    fVar212 = uStack_6f0._4_4_;
                    fVar214 = (float)uStack_6e8;
                    fVar216 = uStack_6e8._4_4_;
                  }
                }
                auVar17 = vpcmpeqd_avx(local_780,_DAT_01f45a50);
                auVar16 = auVar17 ^ _DAT_01f46b70;
                auVar132._8_4_ = 0xff800000;
                auVar132._0_8_ = 0xff800000ff800000;
                auVar132._12_4_ = 0xff800000;
                auVar17 = vblendvps_avx(auVar132,*(undefined1 (*) [16])(local_5f0.ray + 0x80),
                                        auVar17);
                *(undefined1 (*) [16])(local_5f0.ray + 0x80) = auVar17;
              }
              auVar117._8_8_ = 0x100000001;
              auVar117._0_8_ = 0x100000001;
              if ((auVar117 & auVar16) != (undefined1  [16])0x0) {
                uVar84 = CONCAT71((int7)(uVar85 >> 8),1);
                goto LAB_0117b20f;
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = uVar86;
              uVar84 = uVar81 & 0x3f;
              uVar81 = 0;
              uVar85 = uVar85 ^ 1L << uVar84;
              for (uVar84 = uVar85; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                uVar81 = uVar81 + 1;
              }
            }
            uVar84 = 0;
          }
        }
LAB_0117b20f:
        auVar127 = ZEXT3264(local_6a0);
      }
    }
    if (8 < iVar13) {
      local_300._4_4_ = iVar13;
      local_300._0_4_ = iVar13;
      local_300._8_4_ = iVar13;
      local_300._12_4_ = iVar13;
      local_300._16_4_ = iVar13;
      local_300._20_4_ = iVar13;
      local_300._24_4_ = iVar13;
      local_300._28_4_ = iVar13;
      local_340 = (float)local_740._0_4_;
      fStack_33c = (float)local_740._0_4_;
      fStack_338 = (float)local_740._0_4_;
      fStack_334 = (float)local_740._0_4_;
      fStack_330 = (float)local_740._0_4_;
      fStack_32c = (float)local_740._0_4_;
      fStack_328 = (float)local_740._0_4_;
      uStack_324 = local_740._0_4_;
      local_360._4_4_ = local_520._0_4_;
      local_360._0_4_ = local_520._0_4_;
      local_360._8_4_ = local_520._0_4_;
      local_360._12_4_ = local_520._0_4_;
      local_360._16_4_ = local_520._0_4_;
      local_360._20_4_ = local_520._0_4_;
      local_360._24_4_ = local_520._0_4_;
      local_360._28_4_ = local_520._0_4_;
      local_380._4_4_ = 1.0 / (float)local_580._0_4_;
      local_380._0_4_ = local_380._4_4_;
      fStack_378 = (float)local_380._4_4_;
      fStack_374 = (float)local_380._4_4_;
      fStack_370 = (float)local_380._4_4_;
      fStack_36c = (float)local_380._4_4_;
      fStack_368 = (float)local_380._4_4_;
      fStack_364 = (float)local_380._4_4_;
      local_580._4_4_ = (undefined4)local_768;
      local_580._0_4_ = (undefined4)local_768;
      uStack_578 = (undefined4)local_768;
      uStack_574 = (undefined4)local_768;
      local_590._4_4_ = local_590._0_4_;
      local_590._8_4_ = local_590._0_4_;
      local_590._12_4_ = local_590._0_4_;
      _local_560 = auVar200._0_32_;
      for (lVar83 = 8; lVar83 < iVar13; lVar83 = lVar83 + 8) {
        auVar179 = auVar183._0_32_;
        local_740 = *(undefined1 (*) [32])(catmullrom_basis0 + lVar83 * 4 + lVar87);
        auVar125 = *(undefined1 (*) [32])(lVar87 + 0x22047f0 + lVar83 * 4);
        auVar165 = *(undefined1 (*) [32])(lVar87 + 0x2204c74 + lVar83 * 4);
        pauVar5 = (undefined1 (*) [32])(lVar87 + 0x22050f8 + lVar83 * 4);
        fVar106 = *(float *)*pauVar5;
        fVar108 = *(float *)(*pauVar5 + 4);
        fVar110 = *(float *)(*pauVar5 + 8);
        fVar111 = *(float *)(*pauVar5 + 0xc);
        fVar112 = *(float *)(*pauVar5 + 0x10);
        fVar113 = *(float *)(*pauVar5 + 0x14);
        fVar211 = *(float *)(*pauVar5 + 0x18);
        auVar78 = *(undefined1 (*) [28])*pauVar5;
        auVar199._0_4_ = fVar106 * auVar170._0_4_;
        auVar199._4_4_ = fVar108 * auVar170._4_4_;
        auVar199._8_4_ = fVar110 * auVar170._8_4_;
        auVar199._12_4_ = fVar111 * auVar170._12_4_;
        auVar199._16_4_ = fVar112 * auVar170._16_4_;
        auVar199._20_4_ = fVar113 * auVar170._20_4_;
        auVar199._28_36_ = auVar200._28_36_;
        auVar199._24_4_ = fVar211 * auVar170._24_4_;
        auVar200._0_4_ = fVar202 * fVar106;
        auVar200._4_4_ = fVar207 * fVar108;
        auVar200._8_4_ = fVar105 * fVar110;
        auVar200._12_4_ = fVar107 * fVar111;
        auVar200._16_4_ = fVar109 * fVar112;
        auVar200._20_4_ = fVar212 * fVar113;
        auVar200._28_36_ = auVar160._28_36_;
        auVar200._24_4_ = fVar214 * fVar211;
        auVar189 = auVar190._0_32_;
        auVar16 = vfmadd231ps_fma(auVar199._0_32_,auVar165,auVar189);
        auVar17 = vfmadd231ps_fma(auVar200._0_32_,auVar165,auVar143._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar125,auVar217._0_32_);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar125,auVar127._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_740,auVar176._0_32_);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_740,local_4c0);
        auVar95 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar83 * 4 + lVar87);
        auVar103 = *(undefined1 (*) [32])(lVar87 + 0x2206c10 + lVar83 * 4);
        auVar123 = *(undefined1 (*) [32])(lVar87 + 0x2207094 + lVar83 * 4);
        auVar10 = *(undefined1 (*) [32])(lVar87 + 0x2207518 + lVar83 * 4);
        fVar195 = auVar10._0_4_;
        auVar190._0_4_ = fVar195 * auVar170._0_4_;
        fVar201 = auVar10._4_4_;
        auVar190._4_4_ = fVar201 * auVar170._4_4_;
        fVar208 = auVar10._8_4_;
        auVar190._8_4_ = fVar208 * auVar170._8_4_;
        fVar209 = auVar10._12_4_;
        auVar190._12_4_ = fVar209 * auVar170._12_4_;
        fVar210 = auVar10._16_4_;
        auVar190._16_4_ = fVar210 * auVar170._16_4_;
        fVar213 = auVar10._20_4_;
        auVar190._20_4_ = fVar213 * auVar170._20_4_;
        auVar190._28_36_ = auVar183._28_36_;
        fVar215 = auVar10._24_4_;
        auVar190._24_4_ = fVar215 * auVar170._24_4_;
        auVar40._4_4_ = fVar201 * fVar207;
        auVar40._0_4_ = fVar195 * fVar202;
        auVar40._8_4_ = fVar208 * fVar105;
        auVar40._12_4_ = fVar209 * fVar107;
        auVar40._16_4_ = fVar210 * fVar109;
        auVar40._20_4_ = fVar213 * fVar212;
        auVar40._24_4_ = fVar215 * fVar214;
        auVar40._28_4_ = fVar216;
        auVar18 = vfmadd231ps_fma(auVar190._0_32_,auVar123,auVar189);
        auVar19 = vfmadd231ps_fma(auVar40,auVar123,auVar143._0_32_);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar103,auVar217._0_32_);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar103,auVar127._0_32_);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar95,auVar176._0_32_);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar95,local_4c0);
        local_5c0 = ZEXT1632(auVar18);
        local_2c0 = ZEXT1632(auVar16);
        auVar156 = vsubps_avx(local_5c0,local_2c0);
        local_520 = ZEXT1632(auVar19);
        local_540 = ZEXT1632(auVar17);
        auVar97 = vsubps_avx(local_520,local_540);
        auVar41._4_4_ = auVar156._4_4_ * auVar17._4_4_;
        auVar41._0_4_ = auVar156._0_4_ * auVar17._0_4_;
        auVar41._8_4_ = auVar156._8_4_ * auVar17._8_4_;
        auVar41._12_4_ = auVar156._12_4_ * auVar17._12_4_;
        auVar41._16_4_ = auVar156._16_4_ * 0.0;
        auVar41._20_4_ = auVar156._20_4_ * 0.0;
        auVar41._24_4_ = auVar156._24_4_ * 0.0;
        auVar41._28_4_ = auVar123._28_4_;
        fVar128 = auVar97._0_4_;
        auVar183._0_4_ = auVar16._0_4_ * fVar128;
        fVar105 = auVar97._4_4_;
        auVar183._4_4_ = auVar16._4_4_ * fVar105;
        fVar107 = auVar97._8_4_;
        auVar183._8_4_ = auVar16._8_4_ * fVar107;
        fVar109 = auVar97._12_4_;
        auVar183._12_4_ = auVar16._12_4_ * fVar109;
        fVar212 = auVar97._16_4_;
        auVar183._16_4_ = fVar212 * 0.0;
        fVar214 = auVar97._20_4_;
        auVar183._20_4_ = fVar214 * 0.0;
        fVar216 = auVar97._24_4_;
        auVar183._28_36_ = auVar127._28_36_;
        auVar183._24_4_ = fVar216 * 0.0;
        auVar200 = ZEXT3264(auVar165);
        auVar104 = vsubps_avx(auVar41,auVar183._0_32_);
        auVar160._0_4_ = fVar106 * (float)local_e0;
        auVar160._4_4_ = fVar108 * local_e0._4_4_;
        auVar160._8_4_ = fVar110 * (float)uStack_d8;
        auVar160._12_4_ = fVar111 * uStack_d8._4_4_;
        auVar160._16_4_ = fVar112 * (float)uStack_d0;
        auVar160._20_4_ = fVar113 * uStack_d0._4_4_;
        auVar160._28_36_ = auVar170._28_36_;
        auVar160._24_4_ = fVar211 * (float)uStack_c8;
        auVar16 = vfmadd231ps_fma(auVar160._0_32_,auVar165,local_c0);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_a0,auVar125);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_80,local_740);
        auVar160 = ZEXT3264(auVar10);
        auVar42._4_4_ = fVar201 * local_e0._4_4_;
        auVar42._0_4_ = fVar195 * (float)local_e0;
        auVar42._8_4_ = fVar208 * (float)uStack_d8;
        auVar42._12_4_ = fVar209 * uStack_d8._4_4_;
        auVar42._16_4_ = fVar210 * (float)uStack_d0;
        auVar42._20_4_ = fVar213 * uStack_d0._4_4_;
        auVar42._24_4_ = fVar215 * (float)uStack_c8;
        auVar42._28_4_ = uStack_c8._4_4_;
        auVar17 = vfmadd231ps_fma(auVar42,auVar123,local_c0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar103,local_a0);
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar95,local_80);
        auVar43._4_4_ = fVar105 * fVar105;
        auVar43._0_4_ = fVar128 * fVar128;
        auVar43._8_4_ = fVar107 * fVar107;
        auVar43._12_4_ = fVar109 * fVar109;
        auVar43._16_4_ = fVar212 * fVar212;
        auVar43._20_4_ = fVar214 * fVar214;
        auVar43._24_4_ = fVar216 * fVar216;
        auVar43._28_4_ = local_a0._28_4_;
        auVar18 = vfmadd231ps_fma(auVar43,auVar156,auVar156);
        auVar10 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
        auVar180._0_4_ = auVar10._0_4_ * auVar10._0_4_ * auVar18._0_4_;
        auVar180._4_4_ = auVar10._4_4_ * auVar10._4_4_ * auVar18._4_4_;
        auVar180._8_4_ = auVar10._8_4_ * auVar10._8_4_ * auVar18._8_4_;
        auVar180._12_4_ = auVar10._12_4_ * auVar10._12_4_ * auVar18._12_4_;
        auVar180._16_4_ = auVar10._16_4_ * auVar10._16_4_ * 0.0;
        auVar180._20_4_ = auVar10._20_4_ * auVar10._20_4_ * 0.0;
        auVar180._24_4_ = auVar10._24_4_ * auVar10._24_4_ * 0.0;
        auVar180._28_4_ = 0;
        auVar44._4_4_ = auVar104._4_4_ * auVar104._4_4_;
        auVar44._0_4_ = auVar104._0_4_ * auVar104._0_4_;
        auVar44._8_4_ = auVar104._8_4_ * auVar104._8_4_;
        auVar44._12_4_ = auVar104._12_4_ * auVar104._12_4_;
        auVar44._16_4_ = auVar104._16_4_ * auVar104._16_4_;
        auVar44._20_4_ = auVar104._20_4_ * auVar104._20_4_;
        auVar44._24_4_ = auVar104._24_4_ * auVar104._24_4_;
        auVar44._28_4_ = auVar104._28_4_;
        auVar10 = vcmpps_avx(auVar44,auVar180,2);
        local_1c0 = (int)lVar83;
        auVar181._4_4_ = local_1c0;
        auVar181._0_4_ = local_1c0;
        auVar181._8_4_ = local_1c0;
        auVar181._12_4_ = local_1c0;
        auVar181._16_4_ = local_1c0;
        auVar181._20_4_ = local_1c0;
        auVar181._24_4_ = local_1c0;
        auVar181._28_4_ = local_1c0;
        auVar104 = vpor_avx2(auVar181,_DAT_01fb4ba0);
        auVar23 = vpcmpgtd_avx2(local_300,auVar104);
        auVar104 = auVar23 & auVar10;
        fVar202 = (float)local_700;
        fVar207 = local_700._4_4_;
        fVar105 = (float)uStack_6f8;
        fVar107 = uStack_6f8._4_4_;
        fVar109 = (float)uStack_6f0;
        fVar212 = uStack_6f0._4_4_;
        fVar214 = (float)uStack_6e8;
        fVar216 = uStack_6e8._4_4_;
        if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar104 >> 0x7f,0) == '\0') &&
              (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar104 >> 0xbf,0) == '\0') &&
            (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar104[0x1f]) {
          auVar183 = ZEXT3264(auVar179);
          auVar190 = ZEXT3264(auVar189);
LAB_0117ba7f:
          auVar217 = ZEXT3264(local_720);
          auVar170 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,CONCAT416(
                                                  fVar194,CONCAT412(fVar194,CONCAT48(fVar194,
                                                  CONCAT44(fVar194,fVar194))))))));
          auVar127 = ZEXT3264(local_6a0);
          auVar176 = ZEXT3264(local_680);
        }
        else {
          _local_320 = vandps_avx(auVar23,auVar10);
          auVar45._4_4_ = (float)local_560._4_4_ * fVar201;
          auVar45._0_4_ = (float)local_560._0_4_ * fVar195;
          auVar45._8_4_ = fStack_558 * fVar208;
          auVar45._12_4_ = fStack_554 * fVar209;
          auVar45._16_4_ = fStack_550 * fVar210;
          auVar45._20_4_ = fStack_54c * fVar213;
          auVar45._24_4_ = fStack_548 * fVar215;
          auVar45._28_4_ = auVar10._28_4_;
          auVar18 = vfmadd213ps_fma(auVar123,local_240,auVar45);
          auVar18 = vfmadd213ps_fma(auVar103,local_480,ZEXT1632(auVar18));
          auVar18 = vfmadd132ps_fma(auVar95,ZEXT1632(auVar18),local_4a0);
          local_2e0._0_4_ = auVar78._0_4_;
          local_2e0._4_4_ = auVar78._4_4_;
          fStack_2d8 = auVar78._8_4_;
          fStack_2d4 = auVar78._12_4_;
          fStack_2d0 = auVar78._16_4_;
          fStack_2cc = auVar78._20_4_;
          fStack_2c8 = auVar78._24_4_;
          auVar46._4_4_ = (float)local_560._4_4_ * (float)local_2e0._4_4_;
          auVar46._0_4_ = (float)local_560._0_4_ * (float)local_2e0._0_4_;
          auVar46._8_4_ = fStack_558 * fStack_2d8;
          auVar46._12_4_ = fStack_554 * fStack_2d4;
          auVar46._16_4_ = fStack_550 * fStack_2d0;
          auVar46._20_4_ = fStack_54c * fStack_2cc;
          auVar46._24_4_ = fStack_548 * fStack_2c8;
          auVar46._28_4_ = auVar10._28_4_;
          auVar20 = vfmadd213ps_fma(auVar165,local_240,auVar46);
          auVar20 = vfmadd213ps_fma(auVar125,local_480,ZEXT1632(auVar20));
          auVar125 = *(undefined1 (*) [32])(lVar87 + 0x220557c + lVar83 * 4);
          auVar165 = *(undefined1 (*) [32])(lVar87 + 0x2205a00 + lVar83 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar87 + 0x2205e84 + lVar83 * 4);
          pfVar6 = (float *)(lVar87 + 0x2206308 + lVar83 * 4);
          fVar128 = *pfVar6;
          fVar106 = pfVar6[1];
          fVar108 = pfVar6[2];
          fVar110 = pfVar6[3];
          fVar111 = pfVar6[4];
          fVar112 = pfVar6[5];
          fVar113 = pfVar6[6];
          auVar47._4_4_ = fVar106 * fVar194;
          auVar47._0_4_ = fVar128 * fVar194;
          auVar47._8_4_ = fVar108 * fVar194;
          auVar47._12_4_ = fVar110 * fVar194;
          auVar47._16_4_ = fVar111 * fVar194;
          auVar47._20_4_ = fVar112 * fVar194;
          auVar47._24_4_ = fVar113 * fVar194;
          auVar47._28_4_ = auVar156._28_4_;
          auVar197._0_4_ = fVar128 * (float)local_700;
          auVar197._4_4_ = fVar106 * local_700._4_4_;
          auVar197._8_4_ = fVar108 * (float)uStack_6f8;
          auVar197._12_4_ = fVar110 * uStack_6f8._4_4_;
          auVar197._16_4_ = fVar111 * (float)uStack_6f0;
          auVar197._20_4_ = fVar112 * uStack_6f0._4_4_;
          auVar197._24_4_ = fVar113 * (float)uStack_6e8;
          auVar197._28_4_ = 0;
          auVar48._4_4_ = fVar106 * (float)local_560._4_4_;
          auVar48._0_4_ = fVar128 * (float)local_560._0_4_;
          auVar48._8_4_ = fVar108 * fStack_558;
          auVar48._12_4_ = fVar110 * fStack_554;
          auVar48._16_4_ = fVar111 * fStack_550;
          auVar48._20_4_ = fVar112 * fStack_54c;
          auVar48._24_4_ = fVar113 * fStack_548;
          auVar48._28_4_ = pfVar6[7];
          auVar21 = vfmadd231ps_fma(auVar47,auVar95,auVar189);
          auVar93 = vfmadd231ps_fma(auVar197,auVar95,local_660);
          auVar92 = vfmadd231ps_fma(auVar48,local_240,auVar95);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar165,local_720);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar165,local_6a0);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),local_480,auVar165);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar125,local_680);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar125,local_4c0);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar125,local_4a0);
          pfVar6 = (float *)(lVar87 + 0x2208728 + lVar83 * 4);
          fVar128 = *pfVar6;
          fVar106 = pfVar6[1];
          fVar108 = pfVar6[2];
          fVar110 = pfVar6[3];
          fVar111 = pfVar6[4];
          fVar112 = pfVar6[5];
          fVar113 = pfVar6[6];
          auVar49._4_4_ = fVar194 * fVar106;
          auVar49._0_4_ = fVar194 * fVar128;
          auVar49._8_4_ = fVar194 * fVar108;
          auVar49._12_4_ = fVar194 * fVar110;
          auVar49._16_4_ = fVar194 * fVar111;
          auVar49._20_4_ = fVar194 * fVar112;
          auVar49._24_4_ = fVar194 * fVar113;
          auVar49._28_4_ = local_480._28_4_;
          auVar50._4_4_ = local_700._4_4_ * fVar106;
          auVar50._0_4_ = (float)local_700 * fVar128;
          auVar50._8_4_ = (float)uStack_6f8 * fVar108;
          auVar50._12_4_ = uStack_6f8._4_4_ * fVar110;
          auVar50._16_4_ = (float)uStack_6f0 * fVar111;
          auVar50._20_4_ = uStack_6f0._4_4_ * fVar112;
          auVar50._24_4_ = (float)uStack_6e8 * fVar113;
          auVar50._28_4_ = auVar97._28_4_;
          auVar51._4_4_ = fVar106 * (float)local_560._4_4_;
          auVar51._0_4_ = fVar128 * (float)local_560._0_4_;
          auVar51._8_4_ = fVar108 * fStack_558;
          auVar51._12_4_ = fVar110 * fStack_554;
          auVar51._16_4_ = fVar111 * fStack_550;
          auVar51._20_4_ = fVar112 * fStack_54c;
          auVar51._24_4_ = fVar113 * fStack_548;
          auVar51._28_4_ = pfVar6[7];
          auVar125 = *(undefined1 (*) [32])(lVar87 + 0x22082a4 + lVar83 * 4);
          auVar129 = vfmadd231ps_fma(auVar49,auVar125,local_6c0);
          auVar115 = vfmadd231ps_fma(auVar50,auVar125,local_660);
          auVar91 = vfmadd231ps_fma(auVar51,local_240,auVar125);
          auVar125 = *(undefined1 (*) [32])(lVar87 + 0x2207e20 + lVar83 * 4);
          auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar125,local_720);
          auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar125,local_6a0);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar125,local_480);
          auVar125 = *(undefined1 (*) [32])(lVar87 + 0x220799c + lVar83 * 4);
          auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),auVar125,local_680);
          auVar115 = vfmadd231ps_fma(ZEXT1632(auVar115),auVar125,local_4c0);
          auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),local_4a0,auVar125);
          auVar182._8_4_ = 0x7fffffff;
          auVar182._0_8_ = 0x7fffffff7fffffff;
          auVar182._12_4_ = 0x7fffffff;
          auVar182._16_4_ = 0x7fffffff;
          auVar182._20_4_ = 0x7fffffff;
          auVar182._24_4_ = 0x7fffffff;
          auVar182._28_4_ = 0x7fffffff;
          auVar125 = vandps_avx(ZEXT1632(auVar21),auVar182);
          auVar165 = vandps_avx(ZEXT1632(auVar93),auVar182);
          auVar165 = vmaxps_avx(auVar125,auVar165);
          auVar125 = vandps_avx(ZEXT1632(auVar92),auVar182);
          auVar125 = vmaxps_avx(auVar165,auVar125);
          auVar77._4_4_ = fStack_33c;
          auVar77._0_4_ = local_340;
          auVar77._8_4_ = fStack_338;
          auVar77._12_4_ = fStack_334;
          auVar77._16_4_ = fStack_330;
          auVar77._20_4_ = fStack_32c;
          auVar77._24_4_ = fStack_328;
          auVar77._28_4_ = uStack_324;
          auVar125 = vcmpps_avx(auVar125,auVar77,1);
          auVar95 = vblendvps_avx(ZEXT1632(auVar21),auVar156,auVar125);
          auVar103 = vblendvps_avx(ZEXT1632(auVar93),auVar97,auVar125);
          auVar125 = vandps_avx(ZEXT1632(auVar129),auVar182);
          auVar165 = vandps_avx(ZEXT1632(auVar115),auVar182);
          auVar165 = vmaxps_avx(auVar125,auVar165);
          auVar125 = vandps_avx(auVar182,ZEXT1632(auVar91));
          auVar125 = vmaxps_avx(auVar165,auVar125);
          auVar165 = vcmpps_avx(auVar125,auVar77,1);
          auVar125 = vblendvps_avx(ZEXT1632(auVar129),auVar156,auVar165);
          auVar165 = vblendvps_avx(ZEXT1632(auVar115),auVar97,auVar165);
          auVar20 = vfmadd213ps_fma(local_740,local_4a0,ZEXT1632(auVar20));
          auVar21 = vfmadd213ps_fma(auVar95,auVar95,ZEXT832(0) << 0x20);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar103,auVar103);
          auVar123 = vrsqrtps_avx(ZEXT1632(auVar21));
          fVar128 = auVar123._0_4_;
          fVar106 = auVar123._4_4_;
          fVar108 = auVar123._8_4_;
          fVar110 = auVar123._12_4_;
          fVar111 = auVar123._16_4_;
          fVar112 = auVar123._20_4_;
          fVar113 = auVar123._24_4_;
          auVar52._4_4_ = fVar106 * fVar106 * fVar106 * auVar21._4_4_ * -0.5;
          auVar52._0_4_ = fVar128 * fVar128 * fVar128 * auVar21._0_4_ * -0.5;
          auVar52._8_4_ = fVar108 * fVar108 * fVar108 * auVar21._8_4_ * -0.5;
          auVar52._12_4_ = fVar110 * fVar110 * fVar110 * auVar21._12_4_ * -0.5;
          auVar52._16_4_ = fVar111 * fVar111 * fVar111 * -0.0;
          auVar52._20_4_ = fVar112 * fVar112 * fVar112 * -0.0;
          auVar52._24_4_ = fVar113 * fVar113 * fVar113 * -0.0;
          auVar52._28_4_ = 0;
          auVar206._8_4_ = 0x3fc00000;
          auVar206._0_8_ = 0x3fc000003fc00000;
          auVar206._12_4_ = 0x3fc00000;
          auVar206._16_4_ = 0x3fc00000;
          auVar206._20_4_ = 0x3fc00000;
          auVar206._24_4_ = 0x3fc00000;
          auVar206._28_4_ = 0x3fc00000;
          auVar21 = vfmadd231ps_fma(auVar52,auVar206,auVar123);
          fVar128 = auVar21._0_4_;
          fVar106 = auVar21._4_4_;
          auVar53._4_4_ = auVar103._4_4_ * fVar106;
          auVar53._0_4_ = auVar103._0_4_ * fVar128;
          fVar108 = auVar21._8_4_;
          auVar53._8_4_ = auVar103._8_4_ * fVar108;
          fVar110 = auVar21._12_4_;
          auVar53._12_4_ = auVar103._12_4_ * fVar110;
          auVar53._16_4_ = auVar103._16_4_ * 0.0;
          auVar53._20_4_ = auVar103._20_4_ * 0.0;
          auVar53._24_4_ = auVar103._24_4_ * 0.0;
          auVar53._28_4_ = auVar123._28_4_;
          auVar54._4_4_ = fVar106 * -auVar95._4_4_;
          auVar54._0_4_ = fVar128 * -auVar95._0_4_;
          auVar54._8_4_ = fVar108 * -auVar95._8_4_;
          auVar54._12_4_ = fVar110 * -auVar95._12_4_;
          auVar54._16_4_ = -auVar95._16_4_ * 0.0;
          auVar54._20_4_ = -auVar95._20_4_ * 0.0;
          auVar54._24_4_ = -auVar95._24_4_ * 0.0;
          auVar54._28_4_ = auVar103._28_4_;
          auVar21 = vfmadd213ps_fma(auVar125,auVar125,ZEXT832(0) << 0x20);
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar165,auVar165);
          auVar95 = vrsqrtps_avx(ZEXT1632(auVar21));
          auVar55._28_4_ = auVar156._28_4_;
          auVar55._0_28_ =
               ZEXT1628(CONCAT412(fVar110 * 0.0,
                                  CONCAT48(fVar108 * 0.0,CONCAT44(fVar106 * 0.0,fVar128 * 0.0))));
          fVar128 = auVar95._0_4_;
          fVar106 = auVar95._4_4_;
          fVar108 = auVar95._8_4_;
          fVar110 = auVar95._12_4_;
          fVar111 = auVar95._16_4_;
          fVar112 = auVar95._20_4_;
          fVar113 = auVar95._24_4_;
          auVar56._4_4_ = fVar106 * fVar106 * fVar106 * auVar21._4_4_ * -0.5;
          auVar56._0_4_ = fVar128 * fVar128 * fVar128 * auVar21._0_4_ * -0.5;
          auVar56._8_4_ = fVar108 * fVar108 * fVar108 * auVar21._8_4_ * -0.5;
          auVar56._12_4_ = fVar110 * fVar110 * fVar110 * auVar21._12_4_ * -0.5;
          auVar56._16_4_ = fVar111 * fVar111 * fVar111 * -0.0;
          auVar56._20_4_ = fVar112 * fVar112 * fVar112 * -0.0;
          auVar56._24_4_ = fVar113 * fVar113 * fVar113 * -0.0;
          auVar56._28_4_ = 0;
          auVar21 = vfmadd231ps_fma(auVar56,auVar206,auVar95);
          fVar128 = auVar21._0_4_;
          fVar106 = auVar21._4_4_;
          auVar57._4_4_ = auVar165._4_4_ * fVar106;
          auVar57._0_4_ = auVar165._0_4_ * fVar128;
          fVar108 = auVar21._8_4_;
          auVar57._8_4_ = auVar165._8_4_ * fVar108;
          fVar110 = auVar21._12_4_;
          auVar57._12_4_ = auVar165._12_4_ * fVar110;
          auVar57._16_4_ = auVar165._16_4_ * 0.0;
          auVar57._20_4_ = auVar165._20_4_ * 0.0;
          auVar57._24_4_ = auVar165._24_4_ * 0.0;
          auVar57._28_4_ = 0;
          auVar58._4_4_ = fVar106 * -auVar125._4_4_;
          auVar58._0_4_ = fVar128 * -auVar125._0_4_;
          auVar58._8_4_ = fVar108 * -auVar125._8_4_;
          auVar58._12_4_ = fVar110 * -auVar125._12_4_;
          auVar58._16_4_ = -auVar125._16_4_ * 0.0;
          auVar58._20_4_ = -auVar125._20_4_ * 0.0;
          auVar58._24_4_ = -auVar125._24_4_ * 0.0;
          auVar58._28_4_ = auVar95._28_4_;
          auVar59._28_4_ = 0xbf000000;
          auVar59._0_28_ =
               ZEXT1628(CONCAT412(fVar110 * 0.0,
                                  CONCAT48(fVar108 * 0.0,CONCAT44(fVar106 * 0.0,fVar128 * 0.0))));
          auVar21 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar16),local_2c0);
          auVar125 = ZEXT1632(auVar16);
          auVar93 = vfmadd213ps_fma(auVar54,auVar125,local_540);
          auVar92 = vfmadd213ps_fma(auVar55,auVar125,ZEXT1632(auVar20));
          auVar91 = vfnmadd213ps_fma(auVar53,auVar125,local_2c0);
          auVar129 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar17),local_5c0);
          auVar116 = vfnmadd213ps_fma(auVar54,auVar125,local_540);
          auVar125 = ZEXT1632(auVar17);
          auVar115 = vfmadd213ps_fma(auVar58,auVar125,local_520);
          auVar164 = ZEXT1632(auVar16);
          auVar16 = vfnmadd231ps_fma(ZEXT1632(auVar20),auVar164,auVar55);
          auVar20 = vfmadd213ps_fma(auVar59,auVar125,ZEXT1632(auVar18));
          auVar139 = vfnmadd213ps_fma(auVar57,auVar125,local_5c0);
          auVar145 = vfnmadd213ps_fma(auVar58,auVar125,local_520);
          auVar90 = vfnmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar17),auVar59);
          auVar125 = vsubps_avx(ZEXT1632(auVar115),ZEXT1632(auVar116));
          auVar165 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar16));
          auVar168._0_4_ = auVar125._0_4_ * auVar16._0_4_;
          auVar168._4_4_ = auVar125._4_4_ * auVar16._4_4_;
          auVar168._8_4_ = auVar125._8_4_ * auVar16._8_4_;
          auVar168._12_4_ = auVar125._12_4_ * auVar16._12_4_;
          auVar168._16_4_ = auVar125._16_4_ * 0.0;
          auVar168._20_4_ = auVar125._20_4_ * 0.0;
          auVar168._24_4_ = auVar125._24_4_ * 0.0;
          auVar168._28_4_ = 0;
          auVar18 = vfmsub231ps_fma(auVar168,ZEXT1632(auVar116),auVar165);
          auVar60._4_4_ = auVar91._4_4_ * auVar165._4_4_;
          auVar60._0_4_ = auVar91._0_4_ * auVar165._0_4_;
          auVar60._8_4_ = auVar91._8_4_ * auVar165._8_4_;
          auVar60._12_4_ = auVar91._12_4_ * auVar165._12_4_;
          auVar60._16_4_ = auVar165._16_4_ * 0.0;
          auVar60._20_4_ = auVar165._20_4_ * 0.0;
          auVar60._24_4_ = auVar165._24_4_ * 0.0;
          auVar60._28_4_ = auVar165._28_4_;
          auVar156 = ZEXT1632(auVar91);
          auVar165 = vsubps_avx(ZEXT1632(auVar129),auVar156);
          auVar104 = ZEXT1632(auVar16);
          auVar16 = vfmsub231ps_fma(auVar60,auVar104,auVar165);
          auVar61._4_4_ = auVar116._4_4_ * auVar165._4_4_;
          auVar61._0_4_ = auVar116._0_4_ * auVar165._0_4_;
          auVar61._8_4_ = auVar116._8_4_ * auVar165._8_4_;
          auVar61._12_4_ = auVar116._12_4_ * auVar165._12_4_;
          auVar61._16_4_ = auVar165._16_4_ * 0.0;
          auVar61._20_4_ = auVar165._20_4_ * 0.0;
          auVar61._24_4_ = auVar165._24_4_ * 0.0;
          auVar61._28_4_ = auVar165._28_4_;
          auVar91 = vfmsub231ps_fma(auVar61,auVar156,auVar125);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar91),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
          auVar23 = vcmpps_avx(ZEXT1632(auVar16),ZEXT832(0) << 0x20,2);
          auVar125 = vblendvps_avx(ZEXT1632(auVar139),ZEXT1632(auVar21),auVar23);
          auVar165 = vblendvps_avx(ZEXT1632(auVar145),ZEXT1632(auVar93),auVar23);
          auVar95 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar92),auVar23);
          auVar103 = vblendvps_avx(auVar156,ZEXT1632(auVar129),auVar23);
          auVar123 = vblendvps_avx(ZEXT1632(auVar116),ZEXT1632(auVar115),auVar23);
          auVar10 = vblendvps_avx(auVar104,ZEXT1632(auVar20),auVar23);
          auVar156 = vblendvps_avx(ZEXT1632(auVar129),auVar156,auVar23);
          auVar97 = vblendvps_avx(ZEXT1632(auVar115),ZEXT1632(auVar116),auVar23);
          auVar16 = vpackssdw_avx(local_320._0_16_,local_320._16_16_);
          local_740 = ZEXT1632(auVar16);
          auVar104 = vblendvps_avx(ZEXT1632(auVar20),auVar104,auVar23);
          auVar156 = vsubps_avx(auVar156,auVar125);
          auVar97 = vsubps_avx(auVar97,auVar165);
          auVar189 = vsubps_avx(auVar104,auVar95);
          auVar200 = ZEXT3264(auVar189);
          auVar96 = vsubps_avx(auVar125,auVar103);
          auVar98 = vsubps_avx(auVar165,auVar123);
          auVar119 = vsubps_avx(auVar95,auVar10);
          auVar157._0_4_ = auVar189._0_4_ * auVar125._0_4_;
          auVar157._4_4_ = auVar189._4_4_ * auVar125._4_4_;
          auVar157._8_4_ = auVar189._8_4_ * auVar125._8_4_;
          auVar157._12_4_ = auVar189._12_4_ * auVar125._12_4_;
          auVar157._16_4_ = auVar189._16_4_ * auVar125._16_4_;
          auVar157._20_4_ = auVar189._20_4_ * auVar125._20_4_;
          auVar157._24_4_ = auVar189._24_4_ * auVar125._24_4_;
          auVar157._28_4_ = 0;
          auVar18 = vfmsub231ps_fma(auVar157,auVar95,auVar156);
          auVar62._4_4_ = auVar156._4_4_ * auVar165._4_4_;
          auVar62._0_4_ = auVar156._0_4_ * auVar165._0_4_;
          auVar62._8_4_ = auVar156._8_4_ * auVar165._8_4_;
          auVar62._12_4_ = auVar156._12_4_ * auVar165._12_4_;
          auVar62._16_4_ = auVar156._16_4_ * auVar165._16_4_;
          auVar62._20_4_ = auVar156._20_4_ * auVar165._20_4_;
          auVar62._24_4_ = auVar156._24_4_ * auVar165._24_4_;
          auVar62._28_4_ = auVar104._28_4_;
          auVar20 = vfmsub231ps_fma(auVar62,auVar125,auVar97);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar20),ZEXT1632(auVar18),_DAT_01f7b000);
          auVar158._0_4_ = auVar97._0_4_ * auVar95._0_4_;
          auVar158._4_4_ = auVar97._4_4_ * auVar95._4_4_;
          auVar158._8_4_ = auVar97._8_4_ * auVar95._8_4_;
          auVar158._12_4_ = auVar97._12_4_ * auVar95._12_4_;
          auVar158._16_4_ = auVar97._16_4_ * auVar95._16_4_;
          auVar158._20_4_ = auVar97._20_4_ * auVar95._20_4_;
          auVar158._24_4_ = auVar97._24_4_ * auVar95._24_4_;
          auVar158._28_4_ = 0;
          auVar20 = vfmsub231ps_fma(auVar158,auVar165,auVar189);
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar20));
          auVar159._0_4_ = auVar119._0_4_ * auVar103._0_4_;
          auVar159._4_4_ = auVar119._4_4_ * auVar103._4_4_;
          auVar159._8_4_ = auVar119._8_4_ * auVar103._8_4_;
          auVar159._12_4_ = auVar119._12_4_ * auVar103._12_4_;
          auVar159._16_4_ = auVar119._16_4_ * auVar103._16_4_;
          auVar159._20_4_ = auVar119._20_4_ * auVar103._20_4_;
          auVar159._24_4_ = auVar119._24_4_ * auVar103._24_4_;
          auVar159._28_4_ = 0;
          auVar18 = vfmsub231ps_fma(auVar159,auVar96,auVar10);
          auVar63._4_4_ = auVar98._4_4_ * auVar10._4_4_;
          auVar63._0_4_ = auVar98._0_4_ * auVar10._0_4_;
          auVar63._8_4_ = auVar98._8_4_ * auVar10._8_4_;
          auVar63._12_4_ = auVar98._12_4_ * auVar10._12_4_;
          auVar63._16_4_ = auVar98._16_4_ * auVar10._16_4_;
          auVar63._20_4_ = auVar98._20_4_ * auVar10._20_4_;
          auVar63._24_4_ = auVar98._24_4_ * auVar10._24_4_;
          auVar63._28_4_ = auVar10._28_4_;
          auVar21 = vfmsub231ps_fma(auVar63,auVar123,auVar119);
          auVar64._4_4_ = auVar96._4_4_ * auVar123._4_4_;
          auVar64._0_4_ = auVar96._0_4_ * auVar123._0_4_;
          auVar64._8_4_ = auVar96._8_4_ * auVar123._8_4_;
          auVar64._12_4_ = auVar96._12_4_ * auVar123._12_4_;
          auVar64._16_4_ = auVar96._16_4_ * auVar123._16_4_;
          auVar64._20_4_ = auVar96._20_4_ * auVar123._20_4_;
          auVar64._24_4_ = auVar96._24_4_ * auVar123._24_4_;
          auVar64._28_4_ = auVar123._28_4_;
          auVar93 = vfmsub231ps_fma(auVar64,auVar98,auVar103);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar93),ZEXT832(0) << 0x20,ZEXT1632(auVar18));
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar21));
          auVar103 = vmaxps_avx(ZEXT1632(auVar20),ZEXT1632(auVar21));
          auVar103 = vcmpps_avx(auVar103,ZEXT832(0) << 0x20,2);
          auVar18 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
          auVar16 = vpand_avx(auVar18,auVar16);
          auVar103 = vpmovsxwd_avx2(auVar16);
          auVar160 = ZEXT3264(auVar103);
          if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar103 >> 0x7f,0) == '\0') &&
                (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar103 >> 0xbf,0) == '\0') &&
              (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar103[0x1f]) {
LAB_0117bf32:
            auVar142._8_8_ = uStack_4d8;
            auVar142._0_8_ = local_4e0;
            auVar142._16_8_ = uStack_4d0;
            auVar142._24_8_ = uStack_4c8;
            auVar193 = ZEXT3264(auVar193._0_32_);
            auVar183 = ZEXT3264(auVar179);
          }
          else {
            auVar65._4_4_ = auVar97._4_4_ * auVar119._4_4_;
            auVar65._0_4_ = auVar97._0_4_ * auVar119._0_4_;
            auVar65._8_4_ = auVar97._8_4_ * auVar119._8_4_;
            auVar65._12_4_ = auVar97._12_4_ * auVar119._12_4_;
            auVar65._16_4_ = auVar97._16_4_ * auVar119._16_4_;
            auVar65._20_4_ = auVar97._20_4_ * auVar119._20_4_;
            auVar65._24_4_ = auVar97._24_4_ * auVar119._24_4_;
            auVar65._28_4_ = auVar103._28_4_;
            auVar129 = vfmsub231ps_fma(auVar65,auVar98,auVar189);
            auVar169._0_4_ = auVar189._0_4_ * auVar96._0_4_;
            auVar169._4_4_ = auVar189._4_4_ * auVar96._4_4_;
            auVar169._8_4_ = auVar189._8_4_ * auVar96._8_4_;
            auVar169._12_4_ = auVar189._12_4_ * auVar96._12_4_;
            auVar169._16_4_ = auVar189._16_4_ * auVar96._16_4_;
            auVar169._20_4_ = auVar189._20_4_ * auVar96._20_4_;
            auVar169._24_4_ = auVar189._24_4_ * auVar96._24_4_;
            auVar169._28_4_ = 0;
            auVar92 = vfmsub231ps_fma(auVar169,auVar156,auVar119);
            auVar66._4_4_ = auVar156._4_4_ * auVar98._4_4_;
            auVar66._0_4_ = auVar156._0_4_ * auVar98._0_4_;
            auVar66._8_4_ = auVar156._8_4_ * auVar98._8_4_;
            auVar66._12_4_ = auVar156._12_4_ * auVar98._12_4_;
            auVar66._16_4_ = auVar156._16_4_ * auVar98._16_4_;
            auVar66._20_4_ = auVar156._20_4_ * auVar98._20_4_;
            auVar66._24_4_ = auVar156._24_4_ * auVar98._24_4_;
            auVar66._28_4_ = auVar98._28_4_;
            auVar115 = vfmsub231ps_fma(auVar66,auVar96,auVar97);
            auVar18 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar92),ZEXT1632(auVar115));
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar129),ZEXT832(0) << 0x20);
            auVar103 = vrcpps_avx(ZEXT1632(auVar93));
            auVar198._8_4_ = 0x3f800000;
            auVar198._0_8_ = 0x3f8000003f800000;
            auVar198._12_4_ = 0x3f800000;
            auVar198._16_4_ = 0x3f800000;
            auVar198._20_4_ = 0x3f800000;
            auVar198._24_4_ = 0x3f800000;
            auVar198._28_4_ = 0x3f800000;
            auVar200 = ZEXT3264(auVar198);
            auVar18 = vfnmadd213ps_fma(auVar103,ZEXT1632(auVar93),auVar198);
            auVar18 = vfmadd132ps_fma(ZEXT1632(auVar18),auVar103,auVar103);
            auVar140._0_4_ = auVar115._0_4_ * auVar95._0_4_;
            auVar140._4_4_ = auVar115._4_4_ * auVar95._4_4_;
            auVar140._8_4_ = auVar115._8_4_ * auVar95._8_4_;
            auVar140._12_4_ = auVar115._12_4_ * auVar95._12_4_;
            auVar140._16_4_ = auVar95._16_4_ * 0.0;
            auVar140._20_4_ = auVar95._20_4_ * 0.0;
            auVar140._24_4_ = auVar95._24_4_ * 0.0;
            auVar140._28_4_ = 0;
            auVar92 = vfmadd231ps_fma(auVar140,ZEXT1632(auVar92),auVar165);
            auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar125,ZEXT1632(auVar129));
            fVar128 = auVar18._0_4_;
            fVar106 = auVar18._4_4_;
            fVar108 = auVar18._8_4_;
            fVar110 = auVar18._12_4_;
            auVar95 = ZEXT1632(CONCAT412(fVar110 * auVar92._12_4_,
                                         CONCAT48(fVar108 * auVar92._8_4_,
                                                  CONCAT44(fVar106 * auVar92._4_4_,
                                                           fVar128 * auVar92._0_4_))));
            auVar160 = ZEXT3264(auVar95);
            uVar86 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar141._4_4_ = uVar86;
            auVar141._0_4_ = uVar86;
            auVar141._8_4_ = uVar86;
            auVar141._12_4_ = uVar86;
            auVar141._16_4_ = uVar86;
            auVar141._20_4_ = uVar86;
            auVar141._24_4_ = uVar86;
            auVar141._28_4_ = uVar86;
            auVar125 = vcmpps_avx(local_360,auVar95,2);
            auVar165 = vcmpps_avx(auVar95,auVar141,2);
            auVar125 = vandps_avx(auVar165,auVar125);
            auVar18 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
            auVar16 = vpand_avx(auVar16,auVar18);
            auVar125 = vpmovsxwd_avx2(auVar16);
            if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar125 >> 0x7f,0) == '\0') &&
                  (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar125 >> 0xbf,0) == '\0') &&
                (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar125[0x1f]) goto LAB_0117bf32;
            auVar125 = vcmpps_avx(ZEXT1632(auVar93),ZEXT832(0) << 0x20,4);
            auVar18 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
            auVar16 = vpand_avx(auVar16,auVar18);
            auVar125 = vpmovsxwd_avx2(auVar16);
            auVar142._8_8_ = uStack_4d8;
            auVar142._0_8_ = local_4e0;
            auVar142._16_8_ = uStack_4d0;
            auVar142._24_8_ = uStack_4c8;
            auVar193 = ZEXT3264(auVar193._0_32_);
            auVar183 = ZEXT3264(auVar179);
            if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar125 >> 0x7f,0) != '\0') ||
                  (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar125 >> 0xbf,0) != '\0') ||
                (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar125[0x1f] < '\0') {
              auVar103 = ZEXT1632(CONCAT412(fVar110 * auVar20._12_4_,
                                            CONCAT48(fVar108 * auVar20._8_4_,
                                                     CONCAT44(fVar106 * auVar20._4_4_,
                                                              fVar128 * auVar20._0_4_))));
              auVar67._28_4_ = SUB84(uStack_4c8,4);
              auVar67._0_28_ =
                   ZEXT1628(CONCAT412(fVar110 * auVar21._12_4_,
                                      CONCAT48(fVar108 * auVar21._8_4_,
                                               CONCAT44(fVar106 * auVar21._4_4_,
                                                        fVar128 * auVar21._0_4_))));
              auVar175._8_4_ = 0x3f800000;
              auVar175._0_8_ = 0x3f8000003f800000;
              auVar175._12_4_ = 0x3f800000;
              auVar175._16_4_ = 0x3f800000;
              auVar175._20_4_ = 0x3f800000;
              auVar175._24_4_ = 0x3f800000;
              auVar175._28_4_ = 0x3f800000;
              auVar165 = vsubps_avx(auVar175,auVar103);
              auVar165 = vblendvps_avx(auVar165,auVar103,auVar23);
              auVar193 = ZEXT3264(auVar165);
              auVar165 = vsubps_avx(auVar175,auVar67);
              local_3c0 = vblendvps_avx(auVar165,auVar67,auVar23);
              auVar183 = ZEXT3264(auVar95);
              auVar142 = auVar125;
            }
          }
          auVar217 = ZEXT3264(local_720);
          auVar190 = ZEXT3264(local_6c0);
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar142 >> 0x7f,0) == '\0') &&
                (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar142 >> 0xbf,0) == '\0') &&
              (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar142[0x1f]) goto LAB_0117ba7f;
          auVar125 = vsubps_avx(ZEXT1632(auVar17),auVar164);
          local_6e0 = auVar193._0_32_;
          auVar16 = vfmadd213ps_fma(auVar125,local_6e0,auVar164);
          fVar128 = *(float *)((long)local_5f8->ray_space + k * 4 + -0x10);
          auVar68._4_4_ = (auVar16._4_4_ + auVar16._4_4_) * fVar128;
          auVar68._0_4_ = (auVar16._0_4_ + auVar16._0_4_) * fVar128;
          auVar68._8_4_ = (auVar16._8_4_ + auVar16._8_4_) * fVar128;
          auVar68._12_4_ = (auVar16._12_4_ + auVar16._12_4_) * fVar128;
          auVar68._16_4_ = fVar128 * 0.0;
          auVar68._20_4_ = fVar128 * 0.0;
          auVar68._24_4_ = fVar128 * 0.0;
          auVar68._28_4_ = fVar128;
          local_760 = auVar183._0_32_;
          auVar125 = vcmpps_avx(local_760,auVar68,6);
          auVar165 = auVar142 & auVar125;
          auVar170 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,CONCAT416(
                                                  fVar194,CONCAT412(fVar194,CONCAT48(fVar194,
                                                  CONCAT44(fVar194,fVar194))))))));
          auVar176 = ZEXT3264(local_680);
          if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar165 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar165 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar165 >> 0x7f,0) == '\0') &&
                (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar165 >> 0xbf,0) == '\0') &&
              (auVar165 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar165[0x1f]) {
            auVar127 = ZEXT3264(local_6a0);
          }
          else {
            auVar126._8_4_ = 0xbf800000;
            auVar126._0_8_ = 0xbf800000bf800000;
            auVar126._12_4_ = 0xbf800000;
            auVar126._16_4_ = 0xbf800000;
            auVar126._20_4_ = 0xbf800000;
            auVar126._24_4_ = 0xbf800000;
            auVar126._28_4_ = 0xbf800000;
            auVar138._8_4_ = 0x40000000;
            auVar138._0_8_ = 0x4000000040000000;
            auVar138._12_4_ = 0x40000000;
            auVar138._16_4_ = 0x40000000;
            auVar138._20_4_ = 0x40000000;
            auVar138._24_4_ = 0x40000000;
            auVar138._28_4_ = 0x40000000;
            auVar16 = vfmadd213ps_fma(local_3c0,auVar138,auVar126);
            local_200 = ZEXT1632(auVar16);
            local_1b0 = local_610;
            uStack_1a8 = uStack_608;
            local_1a0 = local_620;
            uStack_198 = uStack_618;
            local_190 = local_630;
            uStack_188 = uStack_628;
            pGVar14 = (context->scene->geometries).items[local_768].ptr;
            local_3c0 = local_200;
            if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              pRVar80 = (RTCIntersectArguments *)0x0;
              auVar127 = ZEXT3264(local_6a0);
            }
            else {
              pRVar80 = context->args;
              auVar127 = ZEXT3264(local_6a0);
              if ((pRVar80->filter != (RTCFilterFunctionN)0x0) ||
                 (pRVar80 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar80 >> 8),1),
                 pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                local_520 = ZEXT1632(CONCAT124(auVar19._4_12_,(int)uVar84));
                auVar125 = vandps_avx(auVar125,auVar142);
                fVar128 = (float)local_1c0;
                local_140[0] = (fVar128 + auVar193._0_4_ + 0.0) * (float)local_380._0_4_;
                local_140[1] = (fVar128 + auVar193._4_4_ + 1.0) * (float)local_380._4_4_;
                local_140[2] = (fVar128 + auVar193._8_4_ + 2.0) * fStack_378;
                local_140[3] = (fVar128 + auVar193._12_4_ + 3.0) * fStack_374;
                fStack_130 = (fVar128 + auVar193._16_4_ + 4.0) * fStack_370;
                fStack_12c = (fVar128 + auVar193._20_4_ + 5.0) * fStack_36c;
                fStack_128 = (fVar128 + auVar193._24_4_ + 6.0) * fStack_368;
                fStack_124 = fVar128 + auVar193._28_4_ + 7.0;
                local_3c0._0_8_ = auVar16._0_8_;
                local_3c0._8_8_ = auVar16._8_8_;
                local_120 = local_3c0._0_8_;
                uStack_118 = local_3c0._8_8_;
                uStack_110 = 0;
                uStack_108 = 0;
                local_100 = local_760;
                uVar86 = vmovmskps_avx(auVar125);
                lVar82 = 0;
                uVar81 = CONCAT44((int)((ulong)pRVar80 >> 0x20),uVar86);
                for (uVar84 = uVar81; _local_2e0 = *pauVar5, local_220 = local_6e0,
                    local_1e0 = local_760, local_1bc = iVar13, (uVar84 & 1) == 0;
                    uVar84 = uVar84 >> 1 | 0x8000000000000000) {
                  lVar82 = lVar82 + 1;
                }
                while (uVar81 != 0) {
                  uVar86 = *(undefined4 *)(ray + k * 4 + 0x80);
                  fVar128 = local_140[lVar82];
                  local_420._4_4_ = fVar128;
                  local_420._0_4_ = fVar128;
                  local_420._8_4_ = fVar128;
                  local_420._12_4_ = fVar128;
                  local_740._0_8_ = lVar82;
                  local_410 = *(undefined4 *)((long)&local_120 + lVar82 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_100 + lVar82 * 4);
                  fVar105 = 1.0 - fVar128;
                  auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                            ZEXT416(0xc0a00000));
                  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar128 * fVar128 * 3.0)),
                                            ZEXT416((uint)(fVar128 + fVar128)),auVar16);
                  auVar16 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_420,
                                            ZEXT416(0x40000000));
                  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * fVar105 * -3.0)),
                                            ZEXT416((uint)(fVar105 + fVar105)),auVar16);
                  auVar160 = ZEXT1664(auVar18);
                  auVar19 = vfnmadd231ss_fma(ZEXT416((uint)(fVar128 * (fVar105 + fVar105))),
                                             ZEXT416((uint)fVar105),ZEXT416((uint)fVar105));
                  auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar128 * fVar128)),local_420,
                                            ZEXT416((uint)(fVar105 * -2.0)));
                  fVar128 = auVar18._0_4_ * 0.5;
                  fVar105 = auVar16._0_4_ * 0.5;
                  auVar149._0_4_ = fVar105 * local_570;
                  auVar149._4_4_ = fVar105 * fStack_56c;
                  auVar149._8_4_ = fVar105 * fStack_568;
                  auVar149._12_4_ = fVar105 * fStack_564;
                  auVar133._4_4_ = fVar128;
                  auVar133._0_4_ = fVar128;
                  auVar133._8_4_ = fVar128;
                  auVar133._12_4_ = fVar128;
                  auVar70._8_8_ = uStack_628;
                  auVar70._0_8_ = local_630;
                  auVar16 = vfmadd132ps_fma(auVar133,auVar149,auVar70);
                  fVar128 = auVar17._0_4_ * 0.5;
                  auVar150._4_4_ = fVar128;
                  auVar150._0_4_ = fVar128;
                  auVar150._8_4_ = fVar128;
                  auVar150._12_4_ = fVar128;
                  auVar72._8_8_ = uStack_618;
                  auVar72._0_8_ = local_620;
                  auVar16 = vfmadd132ps_fma(auVar150,auVar16,auVar72);
                  local_5f0.context = context->user;
                  fVar128 = auVar19._0_4_ * 0.5;
                  auVar134._4_4_ = fVar128;
                  auVar134._0_4_ = fVar128;
                  auVar134._8_4_ = fVar128;
                  auVar134._12_4_ = fVar128;
                  auVar74._8_8_ = uStack_608;
                  auVar74._0_8_ = local_610;
                  auVar16 = vfmadd132ps_fma(auVar134,auVar16,auVar74);
                  local_450 = auVar16._0_4_;
                  local_440 = vshufps_avx(auVar16,auVar16,0x55);
                  local_430 = vshufps_avx(auVar16,auVar16,0xaa);
                  local_400 = local_590._0_8_;
                  uStack_3f8 = local_590._8_8_;
                  local_3f0 = _local_580;
                  vpcmpeqd_avx2(ZEXT1632(_local_580),ZEXT1632(_local_580));
                  uStack_3dc = (local_5f0.context)->instID[0];
                  local_3e0 = uStack_3dc;
                  uStack_3d8 = uStack_3dc;
                  uStack_3d4 = uStack_3dc;
                  uStack_3d0 = (local_5f0.context)->instPrimID[0];
                  uStack_3cc = uStack_3d0;
                  uStack_3c8 = uStack_3d0;
                  uStack_3c4 = uStack_3d0;
                  local_780 = *local_600;
                  local_5f0.valid = (int *)local_780;
                  local_5f0.geometryUserPtr = pGVar14->userPtr;
                  local_5f0.hit = (RTCHitN *)&local_450;
                  local_5f0.N = 4;
                  local_5f0.ray = (RTCRayN *)ray;
                  uStack_44c = local_450;
                  uStack_448 = local_450;
                  uStack_444 = local_450;
                  uStack_40c = local_410;
                  uStack_408 = local_410;
                  uStack_404 = local_410;
                  if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar160 = ZEXT1664(auVar18);
                    auVar200 = ZEXT1664(auVar200._0_16_);
                    (*pGVar14->occlusionFilterN)(&local_5f0);
                  }
                  if (local_780 == (undefined1  [16])0x0) {
                    auVar16 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar16 = auVar16 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var15 = context->args->filter;
                    if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar160 = ZEXT1664(auVar160._0_16_);
                      auVar200 = ZEXT1664(auVar200._0_16_);
                      (*p_Var15)(&local_5f0);
                    }
                    auVar17 = vpcmpeqd_avx(local_780,_DAT_01f45a50);
                    auVar16 = auVar17 ^ _DAT_01f46b70;
                    auVar135._8_4_ = 0xff800000;
                    auVar135._0_8_ = 0xff800000ff800000;
                    auVar135._12_4_ = 0xff800000;
                    auVar17 = vblendvps_avx(auVar135,*(undefined1 (*) [16])(local_5f0.ray + 0x80),
                                            auVar17);
                    *(undefined1 (*) [16])(local_5f0.ray + 0x80) = auVar17;
                  }
                  auVar118._8_8_ = 0x100000001;
                  auVar118._0_8_ = 0x100000001;
                  if ((auVar118 & auVar16) != (undefined1  [16])0x0) {
                    pRVar80 = (RTCIntersectArguments *)0x1;
                    goto LAB_0117bf79;
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar86;
                  lVar82 = 0;
                  uVar81 = uVar81 ^ 1L << (local_740._0_8_ & 0x3f);
                  for (uVar84 = uVar81; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000
                      ) {
                    lVar82 = lVar82 + 1;
                  }
                }
                pRVar80 = (RTCIntersectArguments *)0x0;
LAB_0117bf79:
                auVar193 = ZEXT3264(local_6e0);
                auVar183 = ZEXT3264(local_760);
                auVar127 = ZEXT3264(local_6a0);
                auVar190 = ZEXT3264(local_6c0);
                auVar170 = ZEXT3264(CONCAT428(fVar194,CONCAT424(fVar194,CONCAT420(fVar194,CONCAT416(
                                                  fVar194,CONCAT412(fVar194,CONCAT48(fVar194,
                                                  CONCAT44(fVar194,fVar194))))))));
                auVar217 = ZEXT3264(local_720);
                auVar176 = ZEXT3264(local_680);
                uVar84 = (ulong)(uint)local_520._0_4_;
                fVar202 = (float)local_700;
                fVar207 = local_700._4_4_;
                fVar105 = (float)uStack_6f8;
                fVar107 = uStack_6f8._4_4_;
                fVar109 = (float)uStack_6f0;
                fVar212 = uStack_6f0._4_4_;
                fVar214 = (float)uStack_6e8;
                fVar216 = uStack_6e8._4_4_;
              }
            }
            uVar84 = CONCAT71((int7)(uVar84 >> 8),(byte)uVar84 | (byte)pRVar80);
          }
        }
        auVar143 = ZEXT3264(local_660);
      }
    }
    if ((uVar84 & 1) != 0) break;
    uVar86 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar94._4_4_ = uVar86;
    auVar94._0_4_ = uVar86;
    auVar94._8_4_ = uVar86;
    auVar94._12_4_ = uVar86;
    auVar16 = vcmpps_avx(local_2a0,auVar94,2);
    uVar79 = vmovmskps_avx(auVar16);
    local_4e8 = (ulong)((uint)uVar88 & uVar79);
  }
  return local_4e8 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }